

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  RTCRayQueryContext *pRVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  uint uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  uint uVar80;
  uint uVar81;
  long lVar82;
  long lVar83;
  undefined4 uVar84;
  undefined8 unaff_R13;
  uint uVar85;
  bool bVar86;
  float fVar87;
  float fVar116;
  float fVar118;
  vint4 ai;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar88;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar120;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar117;
  float fVar119;
  float fVar121;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar125;
  float fVar149;
  float fVar151;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar150;
  float fVar152;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar153;
  float fVar173;
  float fVar174;
  vint4 bi_2;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar178;
  float fVar180;
  float fVar182;
  undefined1 auVar164 [32];
  float fVar176;
  float fVar183;
  undefined1 auVar165 [32];
  float fVar175;
  float fVar177;
  float fVar179;
  float fVar181;
  float fVar184;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar163 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar185;
  float fVar208;
  float fVar209;
  vint4 bi;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar210;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar211;
  float fVar233;
  float fVar234;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [28];
  float fVar235;
  float fVar238;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar236;
  float fVar237;
  undefined1 auVar232 [64];
  float fVar239;
  float fVar258;
  float fVar259;
  vint4 ai_1;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [28];
  float fVar261;
  float fVar262;
  undefined1 auVar248 [32];
  float fVar260;
  float fVar263;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar264;
  float fVar280;
  float fVar284;
  vint4 bi_1;
  undefined1 auVar268 [16];
  float fVar288;
  undefined1 auVar269 [16];
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [28];
  float fVar281;
  float fVar282;
  float fVar285;
  float fVar286;
  float fVar289;
  float fVar290;
  float fVar293;
  float fVar296;
  float fVar298;
  float fVar299;
  float fVar301;
  undefined1 auVar274 [32];
  float fVar283;
  float fVar287;
  float fVar291;
  float fVar294;
  float fVar297;
  float fVar300;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar292;
  float fVar295;
  undefined1 auVar279 [64];
  vint4 ai_2;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar310;
  float fVar318;
  float fVar319;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar313 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [64];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar327;
  float fVar328;
  float fVar334;
  float fVar336;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [32];
  float fVar335;
  float fVar337;
  float fVar339;
  undefined1 auVar332 [32];
  float fVar338;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar333 [64];
  float fVar343;
  float fVar353;
  float fVar354;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  float fVar355;
  undefined1 auVar352 [64];
  float fVar359;
  float fVar364;
  float fVar365;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar371;
  float fVar377;
  float fVar379;
  undefined1 auVar373 [16];
  float fVar372;
  float fVar378;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar390 [16];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [28];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ce4;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float local_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  RTCFilterFunctionNArguments local_b70;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 (*local_a98) [16];
  undefined1 (*local_a90) [16];
  undefined1 (*local_a88) [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  Primitive *local_948;
  ulong local_940;
  undefined1 auStack_938 [24];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  RTCHitN local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  uint uStack_610;
  uint uStack_60c;
  uint uStack_608;
  uint uStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar9 = prim[1];
  uVar77 = (ulong)(byte)PVar9;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 4 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 5 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 6 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xf + 6)));
  lVar83 = uVar77 * 0x25;
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x11 + 6)));
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x1a + 6)));
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x1b + 6)));
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x1c + 6)));
  auVar127 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar127 = vinsertps_avx(auVar127,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar127 = vsubps_avx(auVar127,*(undefined1 (*) [16])(prim + lVar83 + 6));
  fVar310 = *(float *)(prim + lVar83 + 0x12);
  auVar212._0_4_ = fVar310 * auVar127._0_4_;
  auVar212._4_4_ = fVar310 * auVar127._4_4_;
  auVar212._8_4_ = fVar310 * auVar127._8_4_;
  auVar212._12_4_ = fVar310 * auVar127._12_4_;
  auVar344._0_4_ = fVar310 * auVar17._0_4_;
  auVar344._4_4_ = fVar310 * auVar17._4_4_;
  auVar344._8_4_ = fVar310 * auVar17._8_4_;
  auVar344._12_4_ = fVar310 * auVar17._12_4_;
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar127 = vshufps_avx(auVar344,auVar344,0x55);
  auVar17 = vshufps_avx(auVar344,auVar344,0xaa);
  fVar149 = auVar17._0_4_;
  fVar185 = auVar17._4_4_;
  fVar208 = auVar17._8_4_;
  fVar209 = auVar17._12_4_;
  fVar310 = auVar127._0_4_;
  fVar318 = auVar127._4_4_;
  fVar319 = auVar127._8_4_;
  fVar320 = auVar127._12_4_;
  auVar270 = vcvtdq2ps_avx(auVar21);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar127 = vshufps_avx(auVar344,auVar344,0);
  fVar327 = auVar127._0_4_;
  fVar334 = auVar127._4_4_;
  fVar336 = auVar127._8_4_;
  fVar338 = auVar127._12_4_;
  auVar311._0_4_ = auVar22._0_4_ * fVar310 + fVar149 * auVar23._0_4_ + fVar327 * auVar270._0_4_;
  auVar311._4_4_ = auVar22._4_4_ * fVar318 + fVar185 * auVar23._4_4_ + fVar334 * auVar270._4_4_;
  auVar311._8_4_ = auVar22._8_4_ * fVar319 + fVar208 * auVar23._8_4_ + fVar336 * auVar270._8_4_;
  auVar311._12_4_ = auVar22._12_4_ * fVar320 + fVar209 * auVar23._12_4_ + fVar338 * auVar270._12_4_;
  auVar268._0_4_ = fVar327 * auVar24._0_4_ + fVar310 * auVar25._0_4_ + fVar149 * auVar195._0_4_;
  auVar268._4_4_ = fVar334 * auVar24._4_4_ + fVar318 * auVar25._4_4_ + fVar185 * auVar195._4_4_;
  auVar268._8_4_ = fVar336 * auVar24._8_4_ + fVar319 * auVar25._8_4_ + fVar208 * auVar195._8_4_;
  auVar268._12_4_ = fVar338 * auVar24._12_4_ + fVar320 * auVar25._12_4_ + fVar209 * auVar195._12_4_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar77 * 7 + 6);
  auVar89 = vpmovsxwd_avx(auVar127);
  auVar127 = vcvtdq2ps_avx(auVar192);
  auVar329._0_4_ = fVar149 * auVar159._0_4_ + fVar310 * auVar94._0_4_ + fVar327 * auVar127._0_4_;
  auVar329._4_4_ = fVar185 * auVar159._4_4_ + fVar318 * auVar94._4_4_ + fVar334 * auVar127._4_4_;
  auVar329._8_4_ = fVar208 * auVar159._8_4_ + fVar319 * auVar94._8_4_ + fVar336 * auVar127._8_4_;
  auVar329._12_4_ = fVar209 * auVar159._12_4_ + fVar320 * auVar94._12_4_ + fVar338 * auVar127._12_4_
  ;
  auVar17 = vshufps_avx(auVar212,auVar212,0xaa);
  fVar310 = auVar17._0_4_;
  fVar320 = auVar17._4_4_;
  fVar336 = auVar17._8_4_;
  fVar185 = auVar17._12_4_;
  auVar17 = vshufps_avx(auVar212,auVar212,0x55);
  fVar318 = auVar17._0_4_;
  fVar327 = auVar17._4_4_;
  fVar338 = auVar17._8_4_;
  fVar208 = auVar17._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar77 * 0xb + 6);
  auVar192 = vpmovsxwd_avx(auVar17);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar77 * 9 + 6);
  auVar90 = vpmovsxwd_avx(auVar21);
  auVar17 = vshufps_avx(auVar212,auVar212,0);
  fVar319 = auVar17._0_4_;
  fVar334 = auVar17._4_4_;
  fVar149 = auVar17._8_4_;
  fVar209 = auVar17._12_4_;
  auVar323._0_4_ = auVar22._0_4_ * fVar318 + auVar23._0_4_ * fVar310 + auVar270._0_4_ * fVar319;
  auVar323._4_4_ = auVar22._4_4_ * fVar327 + auVar23._4_4_ * fVar320 + auVar270._4_4_ * fVar334;
  auVar323._8_4_ = auVar22._8_4_ * fVar338 + auVar23._8_4_ * fVar336 + auVar270._8_4_ * fVar149;
  auVar323._12_4_ = auVar22._12_4_ * fVar208 + auVar23._12_4_ * fVar185 + auVar270._12_4_ * fVar209;
  auVar302._0_4_ = auVar195._0_4_ * fVar310 + fVar318 * auVar25._0_4_ + fVar319 * auVar24._0_4_;
  auVar302._4_4_ = auVar195._4_4_ * fVar320 + fVar327 * auVar25._4_4_ + fVar334 * auVar24._4_4_;
  auVar302._8_4_ = auVar195._8_4_ * fVar336 + fVar338 * auVar25._8_4_ + fVar149 * auVar24._8_4_;
  auVar302._12_4_ = auVar195._12_4_ * fVar185 + fVar208 * auVar25._12_4_ + fVar209 * auVar24._12_4_;
  auVar213._0_4_ = auVar127._0_4_ * fVar319 + fVar318 * auVar94._0_4_ + fVar310 * auVar159._0_4_;
  auVar213._4_4_ = auVar127._4_4_ * fVar334 + fVar327 * auVar94._4_4_ + fVar320 * auVar159._4_4_;
  auVar213._8_4_ = auVar127._8_4_ * fVar149 + fVar338 * auVar94._8_4_ + fVar336 * auVar159._8_4_;
  auVar213._12_4_ = auVar127._12_4_ * fVar209 + fVar208 * auVar94._12_4_ + fVar185 * auVar159._12_4_
  ;
  auVar345._8_4_ = 0x7fffffff;
  auVar345._0_8_ = 0x7fffffff7fffffff;
  auVar345._12_4_ = 0x7fffffff;
  auVar127 = vandps_avx(auVar311,auVar345);
  auVar154._8_4_ = 0x219392ef;
  auVar154._0_8_ = 0x219392ef219392ef;
  auVar154._12_4_ = 0x219392ef;
  auVar127 = vcmpps_avx(auVar127,auVar154,1);
  auVar17 = vblendvps_avx(auVar311,auVar154,auVar127);
  auVar127 = vandps_avx(auVar345,auVar268);
  auVar127 = vcmpps_avx(auVar127,auVar154,1);
  auVar21 = vblendvps_avx(auVar268,auVar154,auVar127);
  auVar127 = vandps_avx(auVar329,auVar345);
  auVar127 = vcmpps_avx(auVar127,auVar154,1);
  auVar127 = vblendvps_avx(auVar329,auVar154,auVar127);
  auVar22 = vrcpps_avx(auVar17);
  fVar264 = auVar22._0_4_;
  auVar99._0_4_ = fVar264 * auVar17._0_4_;
  fVar280 = auVar22._4_4_;
  auVar99._4_4_ = fVar280 * auVar17._4_4_;
  fVar284 = auVar22._8_4_;
  auVar99._8_4_ = fVar284 * auVar17._8_4_;
  fVar288 = auVar22._12_4_;
  auVar99._12_4_ = fVar288 * auVar17._12_4_;
  auVar330._8_4_ = 0x3f800000;
  auVar330._0_8_ = 0x3f8000003f800000;
  auVar330._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar330,auVar99);
  fVar264 = fVar264 + fVar264 * auVar17._0_4_;
  fVar280 = fVar280 + fVar280 * auVar17._4_4_;
  fVar284 = fVar284 + fVar284 * auVar17._8_4_;
  fVar288 = fVar288 + fVar288 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar21);
  fVar310 = auVar17._0_4_;
  auVar312._0_4_ = auVar21._0_4_ * fVar310;
  fVar318 = auVar17._4_4_;
  auVar312._4_4_ = auVar21._4_4_ * fVar318;
  fVar319 = auVar17._8_4_;
  auVar312._8_4_ = auVar21._8_4_ * fVar319;
  fVar320 = auVar17._12_4_;
  auVar312._12_4_ = auVar21._12_4_ * fVar320;
  auVar17 = vsubps_avx(auVar330,auVar312);
  fVar310 = auVar17._0_4_ * fVar310 + fVar310;
  fVar318 = auVar17._4_4_ * fVar318 + fVar318;
  fVar319 = auVar17._8_4_ * fVar319 + fVar319;
  fVar320 = auVar17._12_4_ * fVar320 + fVar320;
  auVar17 = vrcpps_avx(auVar127);
  fVar327 = auVar17._0_4_;
  auVar155._0_4_ = fVar327 * auVar127._0_4_;
  fVar334 = auVar17._4_4_;
  auVar155._4_4_ = fVar334 * auVar127._4_4_;
  fVar336 = auVar17._8_4_;
  auVar155._8_4_ = fVar336 * auVar127._8_4_;
  fVar338 = auVar17._12_4_;
  auVar155._12_4_ = fVar338 * auVar127._12_4_;
  auVar127 = vsubps_avx(auVar330,auVar155);
  fVar327 = fVar327 + fVar327 * auVar127._0_4_;
  fVar334 = fVar334 + fVar334 * auVar127._4_4_;
  fVar336 = fVar336 + fVar336 * auVar127._8_4_;
  fVar338 = fVar338 + fVar338 * auVar127._12_4_;
  auVar21 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                         *(float *)(prim + lVar83 + 0x16)) *
                                        *(float *)(prim + lVar83 + 0x1a))),0);
  auVar127 = vcvtdq2ps_avx(auVar89);
  auVar17 = vcvtdq2ps_avx(auVar192);
  auVar17 = vsubps_avx(auVar17,auVar127);
  fVar149 = auVar21._0_4_;
  fVar185 = auVar21._4_4_;
  fVar208 = auVar21._8_4_;
  fVar209 = auVar21._12_4_;
  auVar89._0_4_ = fVar149 * auVar17._0_4_ + auVar127._0_4_;
  auVar89._4_4_ = fVar185 * auVar17._4_4_ + auVar127._4_4_;
  auVar89._8_4_ = fVar208 * auVar17._8_4_ + auVar127._8_4_;
  auVar89._12_4_ = fVar209 * auVar17._12_4_ + auVar127._12_4_;
  auVar127 = vcvtdq2ps_avx(auVar90);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar77 * 0xd + 6);
  auVar17 = vpmovsxwd_avx(auVar22);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar127);
  auVar186._0_4_ = fVar149 * auVar17._0_4_ + auVar127._0_4_;
  auVar186._4_4_ = fVar185 * auVar17._4_4_ + auVar127._4_4_;
  auVar186._8_4_ = fVar208 * auVar17._8_4_ + auVar127._8_4_;
  auVar186._12_4_ = fVar209 * auVar17._12_4_ + auVar127._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar77 * 0x12 + 6);
  auVar127 = vpmovsxwd_avx(auVar23);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar77 * 0x16 + 6);
  auVar17 = vpmovsxwd_avx(auVar25);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar127);
  auVar240._0_4_ = auVar17._0_4_ * fVar149 + auVar127._0_4_;
  auVar240._4_4_ = auVar17._4_4_ * fVar185 + auVar127._4_4_;
  auVar240._8_4_ = auVar17._8_4_ * fVar208 + auVar127._8_4_;
  auVar240._12_4_ = auVar17._12_4_ * fVar209 + auVar127._12_4_;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar77 * 0x14 + 6);
  auVar127 = vpmovsxwd_avx(auVar195);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *(ulong *)(prim + uVar77 * 0x18 + 6);
  auVar17 = vpmovsxwd_avx(auVar270);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar127);
  auVar346._0_4_ = auVar17._0_4_ * fVar149 + auVar127._0_4_;
  auVar346._4_4_ = auVar17._4_4_ * fVar185 + auVar127._4_4_;
  auVar346._8_4_ = auVar17._8_4_ * fVar208 + auVar127._8_4_;
  auVar346._12_4_ = auVar17._12_4_ * fVar209 + auVar127._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar77 * 0x1d + 6);
  auVar127 = vpmovsxwd_avx(auVar24);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar77 * 0x21 + 6);
  auVar17 = vpmovsxwd_avx(auVar94);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar21 = vsubps_avx(auVar17,auVar127);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar77 * 0x1f + 6);
  auVar17 = vpmovsxwd_avx(auVar159);
  auVar360._0_4_ = auVar21._0_4_ * fVar149 + auVar127._0_4_;
  auVar360._4_4_ = auVar21._4_4_ * fVar185 + auVar127._4_4_;
  auVar360._8_4_ = auVar21._8_4_ * fVar208 + auVar127._8_4_;
  auVar360._12_4_ = auVar21._12_4_ * fVar209 + auVar127._12_4_;
  auVar127 = vcvtdq2ps_avx(auVar17);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar77 * 0x23 + 6);
  auVar17 = vpmovsxwd_avx(auVar192);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar127);
  auVar156._0_4_ = auVar127._0_4_ + auVar17._0_4_ * fVar149;
  auVar156._4_4_ = auVar127._4_4_ + auVar17._4_4_ * fVar185;
  auVar156._8_4_ = auVar127._8_4_ + auVar17._8_4_ * fVar208;
  auVar156._12_4_ = auVar127._12_4_ + auVar17._12_4_ * fVar209;
  auVar127 = vsubps_avx(auVar89,auVar323);
  auVar90._0_4_ = fVar264 * auVar127._0_4_;
  auVar90._4_4_ = fVar280 * auVar127._4_4_;
  auVar90._8_4_ = fVar284 * auVar127._8_4_;
  auVar90._12_4_ = fVar288 * auVar127._12_4_;
  auVar127 = vsubps_avx(auVar186,auVar323);
  auVar187._0_4_ = fVar264 * auVar127._0_4_;
  auVar187._4_4_ = fVar280 * auVar127._4_4_;
  auVar187._8_4_ = fVar284 * auVar127._8_4_;
  auVar187._12_4_ = fVar288 * auVar127._12_4_;
  auVar127 = vsubps_avx(auVar240,auVar302);
  auVar241._0_4_ = fVar310 * auVar127._0_4_;
  auVar241._4_4_ = fVar318 * auVar127._4_4_;
  auVar241._8_4_ = fVar319 * auVar127._8_4_;
  auVar241._12_4_ = fVar320 * auVar127._12_4_;
  auVar127 = vsubps_avx(auVar346,auVar302);
  auVar269._0_4_ = fVar310 * auVar127._0_4_;
  auVar269._4_4_ = fVar318 * auVar127._4_4_;
  auVar269._8_4_ = fVar319 * auVar127._8_4_;
  auVar269._12_4_ = fVar320 * auVar127._12_4_;
  auVar127 = vsubps_avx(auVar360,auVar213);
  auVar303._0_4_ = fVar327 * auVar127._0_4_;
  auVar303._4_4_ = fVar334 * auVar127._4_4_;
  auVar303._8_4_ = fVar336 * auVar127._8_4_;
  auVar303._12_4_ = fVar338 * auVar127._12_4_;
  auVar127 = vsubps_avx(auVar156,auVar213);
  auVar157._0_4_ = fVar327 * auVar127._0_4_;
  auVar157._4_4_ = fVar334 * auVar127._4_4_;
  auVar157._8_4_ = fVar336 * auVar127._8_4_;
  auVar157._12_4_ = fVar338 * auVar127._12_4_;
  auVar127 = vpminsd_avx(auVar90,auVar187);
  auVar17 = vpminsd_avx(auVar241,auVar269);
  auVar127 = vmaxps_avx(auVar127,auVar17);
  auVar17 = vpminsd_avx(auVar303,auVar157);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar324._4_4_ = uVar84;
  auVar324._0_4_ = uVar84;
  auVar324._8_4_ = uVar84;
  auVar324._12_4_ = uVar84;
  auVar17 = vmaxps_avx(auVar17,auVar324);
  auVar127 = vmaxps_avx(auVar127,auVar17);
  local_740._0_4_ = auVar127._0_4_ * 0.99999964;
  local_740._4_4_ = auVar127._4_4_ * 0.99999964;
  local_740._8_4_ = auVar127._8_4_ * 0.99999964;
  local_740._12_4_ = auVar127._12_4_ * 0.99999964;
  auVar127 = vpmaxsd_avx(auVar90,auVar187);
  auVar17 = vpmaxsd_avx(auVar241,auVar269);
  auVar127 = vminps_avx(auVar127,auVar17);
  auVar17 = vpmaxsd_avx(auVar303,auVar157);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar188._4_4_ = uVar84;
  auVar188._0_4_ = uVar84;
  auVar188._8_4_ = uVar84;
  auVar188._12_4_ = uVar84;
  auVar17 = vminps_avx(auVar17,auVar188);
  auVar127 = vminps_avx(auVar127,auVar17);
  auVar17 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar17 = vpcmpgtd_avx(auVar17,_DAT_01f4ad30);
  auVar96._0_4_ = auVar127._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar127._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar127._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar127._12_4_ * 1.0000004;
  auVar127 = vcmpps_avx(local_740,auVar96,2);
  auVar127 = vandps_avx(auVar127,auVar17);
  uVar84 = vmovmskps_avx(auVar127);
  uVar77 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar84);
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
  uVar81 = 1 << ((byte)k & 0x1f);
  local_a88 = (undefined1 (*) [32])&local_640;
  local_a90 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar81 & 0xf) << 4));
  local_a98 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar81 >> 4) * 0x10);
  local_948 = prim;
LAB_008fd405:
  if (uVar77 == 0) {
    return;
  }
  lVar83 = 0;
  if (uVar77 != 0) {
    for (; (uVar77 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
    }
  }
  uVar81 = *(uint *)(local_948 + 2);
  local_940 = (ulong)*(uint *)(local_948 + lVar83 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar81].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           local_940 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar310 = (pGVar10->time_range).lower;
  fVar310 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar310) / ((pGVar10->time_range).upper - fVar310));
  auVar127 = vroundss_avx(ZEXT416((uint)fVar310),ZEXT416((uint)fVar310),9);
  auVar127 = vminss_avx(auVar127,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar127 = vmaxss_avx(ZEXT816(0) << 0x20,auVar127);
  fVar310 = fVar310 - auVar127._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar82 = (long)(int)auVar127._0_4_ * 0x38;
  lVar12 = *(long *)(_Var11 + 0x10 + lVar82);
  lVar13 = *(long *)(_Var11 + 0x38 + lVar82);
  lVar14 = *(long *)(_Var11 + 0x48 + lVar82);
  auVar127 = vshufps_avx(ZEXT416((uint)fVar310),ZEXT416((uint)fVar310),0);
  pfVar2 = (float *)(lVar13 + lVar14 * uVar78);
  fVar338 = auVar127._0_4_;
  fVar149 = auVar127._4_4_;
  fVar185 = auVar127._8_4_;
  fVar208 = auVar127._12_4_;
  lVar1 = uVar78 + 1;
  pfVar3 = (float *)(lVar13 + lVar14 * lVar1);
  p_Var15 = pGVar10[4].occlusionFilterN;
  auVar127 = vshufps_avx(ZEXT416((uint)(1.0 - fVar310)),ZEXT416((uint)(1.0 - fVar310)),0);
  pfVar4 = (float *)(*(long *)(_Var11 + lVar82) + lVar12 * uVar78);
  fVar320 = auVar127._0_4_;
  fVar327 = auVar127._4_4_;
  fVar334 = auVar127._8_4_;
  fVar336 = auVar127._12_4_;
  pfVar5 = (float *)(*(long *)(_Var11 + lVar82) + lVar12 * lVar1);
  pfVar6 = (float *)(*(long *)(p_Var15 + lVar82 + 0x38) +
                    uVar78 * *(long *)(p_Var15 + lVar82 + 0x48));
  pfVar7 = (float *)(*(long *)(p_Var15 + lVar82 + 0x38) + *(long *)(p_Var15 + lVar82 + 0x48) * lVar1
                    );
  pfVar8 = (float *)(*(long *)(p_Var15 + lVar82) + *(long *)(p_Var15 + lVar82 + 0x10) * uVar78);
  auVar126._0_4_ = fVar320 * *pfVar4 + fVar338 * *pfVar2;
  auVar126._4_4_ = fVar327 * pfVar4[1] + fVar149 * pfVar2[1];
  auVar126._8_4_ = fVar334 * pfVar4[2] + fVar185 * pfVar2[2];
  auVar126._12_4_ = fVar336 * pfVar4[3] + fVar208 * pfVar2[3];
  pfVar2 = (float *)(*(long *)(p_Var15 + lVar82) + *(long *)(p_Var15 + lVar82 + 0x10) * lVar1);
  auVar158._0_4_ = fVar320 * *pfVar5 + fVar338 * *pfVar3;
  auVar158._4_4_ = fVar327 * pfVar5[1] + fVar149 * pfVar3[1];
  auVar158._8_4_ = fVar334 * pfVar5[2] + fVar185 * pfVar3[2];
  auVar158._12_4_ = fVar336 * pfVar5[3] + fVar208 * pfVar3[3];
  auVar127 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar17 = vinsertps_avx(auVar127,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar310 = *(float *)(ray + k * 4 + 0x80);
  auVar361._4_4_ = fVar310;
  auVar361._0_4_ = fVar310;
  auVar361._8_4_ = fVar310;
  auVar361._12_4_ = fVar310;
  fStack_a70 = fVar310;
  _local_a80 = auVar361;
  fStack_a6c = fVar310;
  fStack_a68 = fVar310;
  fStack_a64 = fVar310;
  fVar318 = *(float *)(ray + k * 4 + 0xa0);
  auVar373._4_4_ = fVar318;
  auVar373._0_4_ = fVar318;
  auVar373._8_4_ = fVar318;
  auVar373._12_4_ = fVar318;
  fStack_7d0 = fVar318;
  _local_7e0 = auVar373;
  fStack_7cc = fVar318;
  fStack_7c8 = fVar318;
  fStack_7c4 = fVar318;
  auVar127 = vunpcklps_avx(auVar361,auVar373);
  fVar319 = *(float *)(ray + k * 4 + 0xc0);
  auVar390._4_4_ = fVar319;
  auVar390._0_4_ = fVar319;
  auVar390._8_4_ = fVar319;
  auVar390._12_4_ = fVar319;
  fStack_8f0 = fVar319;
  _local_900 = auVar390;
  fStack_8ec = fVar319;
  fStack_8e8 = fVar319;
  fStack_8e4 = fVar319;
  _local_a10 = vinsertps_avx(auVar127,auVar390,0x28);
  auVar214._0_4_ = auVar126._0_4_ + (fVar320 * *pfVar8 + fVar338 * *pfVar6) * 0.33333334;
  auVar214._4_4_ = auVar126._4_4_ + (fVar327 * pfVar8[1] + fVar149 * pfVar6[1]) * 0.33333334;
  auVar214._8_4_ = auVar126._8_4_ + (fVar334 * pfVar8[2] + fVar185 * pfVar6[2]) * 0.33333334;
  auVar214._12_4_ = auVar126._12_4_ + (fVar336 * pfVar8[3] + fVar208 * pfVar6[3]) * 0.33333334;
  auVar91._0_4_ = (fVar320 * *pfVar2 + fVar338 * *pfVar7) * 0.33333334;
  auVar91._4_4_ = (fVar327 * pfVar2[1] + fVar149 * pfVar7[1]) * 0.33333334;
  auVar91._8_4_ = (fVar334 * pfVar2[2] + fVar185 * pfVar7[2]) * 0.33333334;
  auVar91._12_4_ = (fVar336 * pfVar2[3] + fVar208 * pfVar7[3]) * 0.33333334;
  auVar22 = vsubps_avx(auVar158,auVar91);
  auVar92._0_4_ = (auVar158._0_4_ + auVar126._0_4_ + auVar214._0_4_ + auVar22._0_4_) * 0.25;
  auVar92._4_4_ = (auVar158._4_4_ + auVar126._4_4_ + auVar214._4_4_ + auVar22._4_4_) * 0.25;
  auVar92._8_4_ = (auVar158._8_4_ + auVar126._8_4_ + auVar214._8_4_ + auVar22._8_4_) * 0.25;
  auVar92._12_4_ = (auVar158._12_4_ + auVar126._12_4_ + auVar214._12_4_ + auVar22._12_4_) * 0.25;
  auVar127 = vsubps_avx(auVar92,auVar17);
  auVar127 = vdpps_avx(auVar127,_local_a10,0x7f);
  local_a20 = vdpps_avx(_local_a10,_local_a10,0x7f);
  auVar21 = vrcpss_avx(local_a20,local_a20);
  fVar320 = auVar127._0_4_ * auVar21._0_4_ * (2.0 - local_a20._0_4_ * auVar21._0_4_);
  auVar21 = vshufps_avx(ZEXT416((uint)fVar320),ZEXT416((uint)fVar320),0);
  auVar189._0_4_ = auVar17._0_4_ + local_a10._0_4_ * auVar21._0_4_;
  auVar189._4_4_ = auVar17._4_4_ + local_a10._4_4_ * auVar21._4_4_;
  auVar189._8_4_ = auVar17._8_4_ + local_a10._8_4_ * auVar21._8_4_;
  auVar189._12_4_ = auVar17._12_4_ + local_a10._12_4_ * auVar21._12_4_;
  auVar127 = vblendps_avx(auVar189,_DAT_01f45a50,8);
  auVar23 = vsubps_avx(auVar126,auVar127);
  auVar22 = vsubps_avx(auVar22,auVar127);
  auVar25 = vsubps_avx(auVar214,auVar127);
  _local_b80 = vsubps_avx(auVar158,auVar127);
  auVar127 = vshufps_avx(auVar23,auVar23,0);
  local_360._16_16_ = auVar127;
  local_360._0_16_ = auVar127;
  auVar127 = vshufps_avx(auVar23,auVar23,0x55);
  register0x00001250 = auVar127;
  _local_1e0 = auVar127;
  auVar127 = vshufps_avx(auVar23,auVar23,0xaa);
  local_380._16_16_ = auVar127;
  local_380._0_16_ = auVar127;
  auVar17 = vshufps_avx(auVar23,auVar23,0xff);
  auVar127 = vshufps_avx(auVar25,auVar25,0);
  local_8c0._16_16_ = auVar127;
  local_8c0._0_16_ = auVar127;
  auVar127 = vshufps_avx(auVar25,auVar25,0x55);
  local_a40._16_16_ = auVar127;
  local_a40._0_16_ = auVar127;
  auVar127 = vshufps_avx(auVar25,auVar25,0xaa);
  auVar351._16_16_ = auVar127;
  auVar351._0_16_ = auVar127;
  auVar127 = vshufps_avx(auVar25,auVar25,0xff);
  auVar232 = ZEXT3264(local_8c0);
  local_9c0._16_16_ = auVar127;
  local_9c0._0_16_ = auVar127;
  auVar279 = ZEXT3264(local_9c0);
  auVar127 = vshufps_avx(auVar22,auVar22,0);
  local_3a0._16_16_ = auVar127;
  local_3a0._0_16_ = auVar127;
  auVar127 = vshufps_avx(auVar22,auVar22,0x55);
  local_3c0._16_16_ = auVar127;
  local_3c0._0_16_ = auVar127;
  auVar127 = vshufps_avx(auVar22,auVar22,0xaa);
  register0x00001290 = auVar127;
  _local_200 = auVar127;
  auVar127 = vshufps_avx(auVar22,auVar22,0xff);
  register0x00001290 = auVar127;
  _local_220 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0);
  register0x00001290 = auVar127;
  _local_240 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0x55);
  register0x00001290 = auVar127;
  _local_260 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0xaa);
  register0x00001290 = auVar127;
  _local_280 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0xff);
  register0x00001290 = auVar127;
  _local_2a0 = auVar127;
  auVar127 = ZEXT416((uint)(fVar310 * fVar310 + fVar318 * fVar318 + fVar319 * fVar319));
  auVar127 = vshufps_avx(auVar127,auVar127,0);
  local_2c0._16_16_ = auVar127;
  local_2c0._0_16_ = auVar127;
  fVar310 = *(float *)(ray + k * 4 + 0x60);
  local_960 = ZEXT416((uint)fVar320);
  auVar127 = vshufps_avx(ZEXT416((uint)(fVar310 - fVar320)),ZEXT416((uint)(fVar310 - fVar320)),0);
  local_3e0._16_16_ = auVar127;
  local_3e0._0_16_ = auVar127;
  auVar127 = vpshufd_avx(ZEXT416(uVar81),0);
  local_5a0._16_16_ = auVar127;
  local_5a0._0_16_ = auVar127;
  auVar127 = vpshufd_avx(ZEXT416(*(uint *)(local_948 + lVar83 * 4 + 6)),0);
  local_5c0._16_16_ = auVar127;
  local_5c0._0_16_ = auVar127;
  register0x00001210 = auVar21;
  _local_920 = auVar21;
  uVar78 = 0;
  local_ce4 = 1;
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  auVar102._16_4_ = 0x7fffffff;
  auVar102._20_4_ = 0x7fffffff;
  auVar102._24_4_ = 0x7fffffff;
  auVar102._28_4_ = 0x7fffffff;
  local_580 = vandps_avx(local_2c0,auVar102);
  auVar127 = vsqrtss_avx(local_a20,local_a20);
  auVar21 = vsqrtss_avx(local_a20,local_a20);
  auVar333 = ZEXT3264(local_a40);
  local_730 = ZEXT816(0x3f80000000000000);
  local_b00 = auVar351;
  do {
    auVar248._8_4_ = 0x3f800000;
    auVar248._0_8_ = 0x3f8000003f800000;
    auVar248._12_4_ = 0x3f800000;
    auVar248._16_4_ = 0x3f800000;
    auVar248._20_4_ = 0x3f800000;
    auVar248._24_4_ = 0x3f800000;
    auVar248._28_4_ = 0x3f800000;
    auVar195 = vmovshdup_avx(local_730);
    auVar24 = vsubps_avx(auVar195,local_730);
    auVar195 = vshufps_avx(local_730,local_730,0);
    local_840._16_16_ = auVar195;
    local_840._0_16_ = auVar195;
    auVar270 = vshufps_avx(auVar24,auVar24,0);
    local_860._16_16_ = auVar270;
    local_860._0_16_ = auVar270;
    fVar125 = auVar270._0_4_;
    fVar150 = auVar270._4_4_;
    fVar151 = auVar270._8_4_;
    fVar152 = auVar270._12_4_;
    fVar87 = auVar195._0_4_;
    auVar139._0_4_ = fVar87 + fVar125 * 0.0;
    fVar116 = auVar195._4_4_;
    auVar139._4_4_ = fVar116 + fVar150 * 0.14285715;
    fVar118 = auVar195._8_4_;
    auVar139._8_4_ = fVar118 + fVar151 * 0.2857143;
    fVar120 = auVar195._12_4_;
    auVar139._12_4_ = fVar120 + fVar152 * 0.42857146;
    auVar139._16_4_ = fVar87 + fVar125 * 0.5714286;
    auVar139._20_4_ = fVar116 + fVar150 * 0.71428573;
    auVar139._24_4_ = fVar118 + fVar151 * 0.8571429;
    auVar139._28_4_ = fVar120 + fVar152;
    auVar101 = vsubps_avx(auVar248,auVar139);
    fVar318 = auVar101._0_4_;
    fVar319 = auVar101._4_4_;
    fVar320 = auVar101._8_4_;
    fVar327 = auVar101._12_4_;
    fVar334 = auVar101._16_4_;
    fVar336 = auVar101._20_4_;
    fVar338 = auVar101._24_4_;
    fVar182 = auVar232._28_4_;
    fVar210 = auVar279._28_4_ + fVar182 + auVar351._28_4_ + 1.0 + 1.0;
    fVar149 = local_380._28_4_;
    fVar265 = local_3a0._0_4_ * auVar139._0_4_ + auVar232._0_4_ * fVar318;
    fVar281 = local_3a0._4_4_ * auVar139._4_4_ + auVar232._4_4_ * fVar319;
    fVar285 = local_3a0._8_4_ * auVar139._8_4_ + auVar232._8_4_ * fVar320;
    fVar289 = local_3a0._12_4_ * auVar139._12_4_ + auVar232._12_4_ * fVar327;
    fVar292 = local_3a0._16_4_ * auVar139._16_4_ + auVar232._16_4_ * fVar334;
    fVar295 = local_3a0._20_4_ * auVar139._20_4_ + auVar232._20_4_ * fVar336;
    fVar298 = local_3a0._24_4_ * auVar139._24_4_ + auVar232._24_4_ * fVar338;
    fVar185 = local_3c0._0_4_ * auVar139._0_4_ + auVar333._0_4_ * fVar318;
    fVar208 = local_3c0._4_4_ * auVar139._4_4_ + auVar333._4_4_ * fVar319;
    fVar209 = local_3c0._8_4_ * auVar139._8_4_ + auVar333._8_4_ * fVar320;
    fVar264 = local_3c0._12_4_ * auVar139._12_4_ + auVar333._12_4_ * fVar327;
    fVar280 = local_3c0._16_4_ * auVar139._16_4_ + auVar333._16_4_ * fVar334;
    fVar284 = local_3c0._20_4_ * auVar139._20_4_ + auVar333._20_4_ * fVar336;
    fVar288 = local_3c0._24_4_ * auVar139._24_4_ + auVar333._24_4_ * fVar338;
    fVar211 = (float)local_200._0_4_ * auVar139._0_4_ + auVar351._0_4_ * fVar318;
    fVar233 = (float)local_200._4_4_ * auVar139._4_4_ + auVar351._4_4_ * fVar319;
    fVar234 = fStack_1f8 * auVar139._8_4_ + auVar351._8_4_ * fVar320;
    fVar235 = fStack_1f4 * auVar139._12_4_ + auVar351._12_4_ * fVar327;
    fVar236 = fStack_1f0 * auVar139._16_4_ + auVar351._16_4_ * fVar334;
    fVar237 = fStack_1ec * auVar139._20_4_ + auVar351._20_4_ * fVar336;
    fVar238 = fStack_1e8 * auVar139._24_4_ + auVar351._24_4_ * fVar338;
    fVar239 = (float)local_220._0_4_ * auVar139._0_4_ + auVar279._0_4_ * fVar318;
    fVar258 = (float)local_220._4_4_ * auVar139._4_4_ + auVar279._4_4_ * fVar319;
    fVar259 = fStack_218 * auVar139._8_4_ + auVar279._8_4_ * fVar320;
    fVar260 = fStack_214 * auVar139._12_4_ + auVar279._12_4_ * fVar327;
    fVar261 = fStack_210 * auVar139._16_4_ + auVar279._16_4_ * fVar334;
    fVar262 = fStack_20c * auVar139._20_4_ + auVar279._20_4_ * fVar336;
    fVar263 = fStack_208 * auVar139._24_4_ + auVar279._24_4_ * fVar338;
    fVar389 = fVar149 + fVar182;
    fVar370 = auVar17._12_4_ + fVar149;
    auVar314._0_4_ =
         fVar318 * (auVar232._0_4_ * auVar139._0_4_ + local_360._0_4_ * fVar318) +
         auVar139._0_4_ * fVar265;
    auVar314._4_4_ =
         fVar319 * (auVar232._4_4_ * auVar139._4_4_ + local_360._4_4_ * fVar319) +
         auVar139._4_4_ * fVar281;
    auVar314._8_4_ =
         fVar320 * (auVar232._8_4_ * auVar139._8_4_ + local_360._8_4_ * fVar320) +
         auVar139._8_4_ * fVar285;
    auVar314._12_4_ =
         fVar327 * (auVar232._12_4_ * auVar139._12_4_ + local_360._12_4_ * fVar327) +
         auVar139._12_4_ * fVar289;
    auVar314._16_4_ =
         fVar334 * (auVar232._16_4_ * auVar139._16_4_ + local_360._16_4_ * fVar334) +
         auVar139._16_4_ * fVar292;
    auVar314._20_4_ =
         fVar336 * (auVar232._20_4_ * auVar139._20_4_ + local_360._20_4_ * fVar336) +
         auVar139._20_4_ * fVar295;
    auVar314._24_4_ =
         fVar338 * (auVar232._24_4_ * auVar139._24_4_ + local_360._24_4_ * fVar338) +
         auVar139._24_4_ * fVar298;
    auVar314._28_4_ = local_3a0._28_4_ + fVar149;
    auVar331._0_4_ =
         fVar318 * (auVar333._0_4_ * auVar139._0_4_ + fVar318 * (float)local_1e0._0_4_) +
         auVar139._0_4_ * fVar185;
    auVar331._4_4_ =
         fVar319 * (auVar333._4_4_ * auVar139._4_4_ + fVar319 * (float)local_1e0._4_4_) +
         auVar139._4_4_ * fVar208;
    auVar331._8_4_ =
         fVar320 * (auVar333._8_4_ * auVar139._8_4_ + fVar320 * fStack_1d8) +
         auVar139._8_4_ * fVar209;
    auVar331._12_4_ =
         fVar327 * (auVar333._12_4_ * auVar139._12_4_ + fVar327 * fStack_1d4) +
         auVar139._12_4_ * fVar264;
    auVar331._16_4_ =
         fVar334 * (auVar333._16_4_ * auVar139._16_4_ + fVar334 * fStack_1d0) +
         auVar139._16_4_ * fVar280;
    auVar331._20_4_ =
         fVar336 * (auVar333._20_4_ * auVar139._20_4_ + fVar336 * fStack_1cc) +
         auVar139._20_4_ * fVar284;
    auVar331._24_4_ =
         fVar338 * (auVar333._24_4_ * auVar139._24_4_ + fVar338 * fStack_1c8) +
         auVar139._24_4_ * fVar288;
    auVar331._28_4_ = local_3c0._28_4_ + fVar149;
    auVar347._0_4_ =
         fVar318 * (auVar351._0_4_ * auVar139._0_4_ + local_380._0_4_ * fVar318) +
         auVar139._0_4_ * fVar211;
    auVar347._4_4_ =
         fVar319 * (auVar351._4_4_ * auVar139._4_4_ + local_380._4_4_ * fVar319) +
         auVar139._4_4_ * fVar233;
    auVar347._8_4_ =
         fVar320 * (auVar351._8_4_ * auVar139._8_4_ + local_380._8_4_ * fVar320) +
         auVar139._8_4_ * fVar234;
    auVar347._12_4_ =
         fVar327 * (auVar351._12_4_ * auVar139._12_4_ + local_380._12_4_ * fVar327) +
         auVar139._12_4_ * fVar235;
    auVar347._16_4_ =
         fVar334 * (auVar351._16_4_ * auVar139._16_4_ + local_380._16_4_ * fVar334) +
         auVar139._16_4_ * fVar236;
    auVar347._20_4_ =
         fVar336 * (auVar351._20_4_ * auVar139._20_4_ + local_380._20_4_ * fVar336) +
         auVar139._20_4_ * fVar237;
    auVar347._24_4_ =
         fVar338 * (auVar351._24_4_ * auVar139._24_4_ + local_380._24_4_ * fVar338) +
         auVar139._24_4_ * fVar238;
    auVar347._28_4_ = fStack_1e4 + fVar149;
    auVar305._0_4_ =
         auVar139._0_4_ * fVar239 +
         fVar318 * (auVar279._0_4_ * auVar139._0_4_ + auVar17._0_4_ * fVar318);
    auVar305._4_4_ =
         auVar139._4_4_ * fVar258 +
         fVar319 * (auVar279._4_4_ * auVar139._4_4_ + auVar17._4_4_ * fVar319);
    auVar305._8_4_ =
         auVar139._8_4_ * fVar259 +
         fVar320 * (auVar279._8_4_ * auVar139._8_4_ + auVar17._8_4_ * fVar320);
    auVar305._12_4_ =
         auVar139._12_4_ * fVar260 +
         fVar327 * (auVar279._12_4_ * auVar139._12_4_ + auVar17._12_4_ * fVar327);
    auVar305._16_4_ =
         auVar139._16_4_ * fVar261 +
         fVar334 * (auVar279._16_4_ * auVar139._16_4_ + auVar17._0_4_ * fVar334);
    auVar305._20_4_ =
         auVar139._20_4_ * fVar262 +
         fVar336 * (auVar279._20_4_ * auVar139._20_4_ + auVar17._4_4_ * fVar336);
    auVar305._24_4_ =
         auVar139._24_4_ * fVar263 +
         fVar338 * (auVar279._24_4_ * auVar139._24_4_ + auVar17._8_4_ * fVar338);
    auVar305._28_4_ = fStack_1e4 + fStack_204;
    auVar103._0_4_ =
         (auVar139._0_4_ * (float)local_240._0_4_ + local_3a0._0_4_ * fVar318) * auVar139._0_4_ +
         fVar318 * fVar265;
    auVar103._4_4_ =
         (auVar139._4_4_ * (float)local_240._4_4_ + local_3a0._4_4_ * fVar319) * auVar139._4_4_ +
         fVar319 * fVar281;
    auVar103._8_4_ =
         (auVar139._8_4_ * fStack_238 + local_3a0._8_4_ * fVar320) * auVar139._8_4_ +
         fVar320 * fVar285;
    auVar103._12_4_ =
         (auVar139._12_4_ * fStack_234 + local_3a0._12_4_ * fVar327) * auVar139._12_4_ +
         fVar327 * fVar289;
    auVar103._16_4_ =
         (auVar139._16_4_ * fStack_230 + local_3a0._16_4_ * fVar334) * auVar139._16_4_ +
         fVar334 * fVar292;
    auVar103._20_4_ =
         (auVar139._20_4_ * fStack_22c + local_3a0._20_4_ * fVar336) * auVar139._20_4_ +
         fVar336 * fVar295;
    auVar103._24_4_ =
         (auVar139._24_4_ * fStack_228 + local_3a0._24_4_ * fVar338) * auVar139._24_4_ +
         fVar338 * fVar298;
    auVar103._28_4_ = fStack_1e4 + fVar210 + auVar279._28_4_;
    auVar204._0_4_ =
         (auVar139._0_4_ * (float)local_260._0_4_ + local_3c0._0_4_ * fVar318) * auVar139._0_4_ +
         fVar318 * fVar185;
    auVar204._4_4_ =
         (auVar139._4_4_ * (float)local_260._4_4_ + local_3c0._4_4_ * fVar319) * auVar139._4_4_ +
         fVar319 * fVar208;
    auVar204._8_4_ =
         (auVar139._8_4_ * fStack_258 + local_3c0._8_4_ * fVar320) * auVar139._8_4_ +
         fVar320 * fVar209;
    auVar204._12_4_ =
         (auVar139._12_4_ * fStack_254 + local_3c0._12_4_ * fVar327) * auVar139._12_4_ +
         fVar327 * fVar264;
    auVar204._16_4_ =
         (auVar139._16_4_ * fStack_250 + local_3c0._16_4_ * fVar334) * auVar139._16_4_ +
         fVar334 * fVar280;
    auVar204._20_4_ =
         (auVar139._20_4_ * fStack_24c + local_3c0._20_4_ * fVar336) * auVar139._20_4_ +
         fVar336 * fVar284;
    auVar204._24_4_ =
         (auVar139._24_4_ * fStack_248 + local_3c0._24_4_ * fVar338) * auVar139._24_4_ +
         fVar338 * fVar288;
    auVar204._28_4_ = fStack_1e4 + fVar182 + fVar210;
    auVar224._0_4_ =
         (auVar139._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar318) *
         auVar139._0_4_ + fVar318 * fVar211;
    auVar224._4_4_ =
         (auVar139._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar319) *
         auVar139._4_4_ + fVar319 * fVar233;
    auVar224._8_4_ =
         (auVar139._8_4_ * fStack_278 + fStack_1f8 * fVar320) * auVar139._8_4_ + fVar320 * fVar234;
    auVar224._12_4_ =
         (auVar139._12_4_ * fStack_274 + fStack_1f4 * fVar327) * auVar139._12_4_ + fVar327 * fVar235
    ;
    auVar224._16_4_ =
         (auVar139._16_4_ * fStack_270 + fStack_1f0 * fVar334) * auVar139._16_4_ + fVar334 * fVar236
    ;
    auVar224._20_4_ =
         (auVar139._20_4_ * fStack_26c + fStack_1ec * fVar336) * auVar139._20_4_ + fVar336 * fVar237
    ;
    auVar224._24_4_ =
         (auVar139._24_4_ * fStack_268 + fStack_1e8 * fVar338) * auVar139._24_4_ + fVar338 * fVar238
    ;
    auVar224._28_4_ = fVar370 + fVar182 + 1.0;
    auVar249._0_4_ =
         (auVar139._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar318) *
         auVar139._0_4_ + fVar318 * fVar239;
    auVar249._4_4_ =
         (auVar139._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar319) *
         auVar139._4_4_ + fVar319 * fVar258;
    auVar249._8_4_ =
         (auVar139._8_4_ * fStack_298 + fStack_218 * fVar320) * auVar139._8_4_ + fVar320 * fVar259;
    auVar249._12_4_ =
         (auVar139._12_4_ * fStack_294 + fStack_214 * fVar327) * auVar139._12_4_ + fVar327 * fVar260
    ;
    auVar249._16_4_ =
         (auVar139._16_4_ * fStack_290 + fStack_210 * fVar334) * auVar139._16_4_ + fVar334 * fVar261
    ;
    auVar249._20_4_ =
         (auVar139._20_4_ * fStack_28c + fStack_20c * fVar336) * auVar139._20_4_ + fVar336 * fVar262
    ;
    auVar249._24_4_ =
         (auVar139._24_4_ * fStack_288 + fStack_208 * fVar338) * auVar139._24_4_ + fVar338 * fVar263
    ;
    auVar249._28_4_ = fVar389 + fVar149 + 1.0;
    fVar266 = auVar314._0_4_ * fVar318 + auVar139._0_4_ * auVar103._0_4_;
    fVar282 = auVar314._4_4_ * fVar319 + auVar139._4_4_ * auVar103._4_4_;
    fVar286 = auVar314._8_4_ * fVar320 + auVar139._8_4_ * auVar103._8_4_;
    fVar290 = auVar314._12_4_ * fVar327 + auVar139._12_4_ * auVar103._12_4_;
    fVar293 = auVar314._16_4_ * fVar334 + auVar139._16_4_ * auVar103._16_4_;
    fVar296 = auVar314._20_4_ * fVar336 + auVar139._20_4_ * auVar103._20_4_;
    fVar299 = auVar314._24_4_ * fVar338 + auVar139._24_4_ * auVar103._24_4_;
    fVar301 = fVar389 + fStack_1e4;
    auVar391._0_4_ = auVar331._0_4_ * fVar318 + auVar139._0_4_ * auVar204._0_4_;
    auVar391._4_4_ = auVar331._4_4_ * fVar319 + auVar139._4_4_ * auVar204._4_4_;
    auVar391._8_4_ = auVar331._8_4_ * fVar320 + auVar139._8_4_ * auVar204._8_4_;
    auVar391._12_4_ = auVar331._12_4_ * fVar327 + auVar139._12_4_ * auVar204._12_4_;
    auVar391._16_4_ = auVar331._16_4_ * fVar334 + auVar139._16_4_ * auVar204._16_4_;
    auVar391._20_4_ = auVar331._20_4_ * fVar336 + auVar139._20_4_ * auVar204._20_4_;
    auVar391._24_4_ = auVar331._24_4_ * fVar338 + auVar139._24_4_ * auVar204._24_4_;
    auVar391._28_4_ = fStack_1e4 + fVar370;
    local_2e0._0_4_ = auVar347._0_4_ * fVar318 + auVar139._0_4_ * auVar224._0_4_;
    local_2e0._4_4_ = auVar347._4_4_ * fVar319 + auVar139._4_4_ * auVar224._4_4_;
    local_2e0._8_4_ = auVar347._8_4_ * fVar320 + auVar139._8_4_ * auVar224._8_4_;
    local_2e0._12_4_ = auVar347._12_4_ * fVar327 + auVar139._12_4_ * auVar224._12_4_;
    local_2e0._16_4_ = auVar347._16_4_ * fVar334 + auVar139._16_4_ * auVar224._16_4_;
    local_2e0._20_4_ = auVar347._20_4_ * fVar336 + auVar139._20_4_ * auVar224._20_4_;
    local_2e0._24_4_ = auVar347._24_4_ * fVar338 + auVar139._24_4_ * auVar224._24_4_;
    local_2e0._28_4_ = fVar370 + fStack_1e4;
    local_b20._0_4_ = auVar24._0_4_;
    auVar274._0_4_ = fVar318 * auVar305._0_4_ + auVar139._0_4_ * auVar249._0_4_;
    auVar274._4_4_ = fVar319 * auVar305._4_4_ + auVar139._4_4_ * auVar249._4_4_;
    auVar274._8_4_ = fVar320 * auVar305._8_4_ + auVar139._8_4_ * auVar249._8_4_;
    auVar274._12_4_ = fVar327 * auVar305._12_4_ + auVar139._12_4_ * auVar249._12_4_;
    auVar274._16_4_ = fVar334 * auVar305._16_4_ + auVar139._16_4_ * auVar249._16_4_;
    auVar274._20_4_ = fVar336 * auVar305._20_4_ + auVar139._20_4_ * auVar249._20_4_;
    auVar274._24_4_ = fVar338 * auVar305._24_4_ + auVar139._24_4_ * auVar249._24_4_;
    auVar274._28_4_ = auVar101._28_4_ + auVar139._28_4_;
    auVar101 = vsubps_avx(auVar103,auVar314);
    auVar225 = vsubps_avx(auVar204,auVar331);
    auVar102 = vsubps_avx(auVar224,auVar347);
    auVar351 = vsubps_avx(auVar249,auVar305);
    auVar195 = vshufps_avx(ZEXT416((uint)((float)local_b20._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_b20._0_4_ * 0.04761905)),0);
    fVar233 = auVar195._0_4_;
    fVar359 = fVar233 * auVar101._0_4_ * 3.0;
    fVar234 = auVar195._4_4_;
    fVar364 = fVar234 * auVar101._4_4_ * 3.0;
    auVar31._4_4_ = fVar364;
    auVar31._0_4_ = fVar359;
    fVar182 = auVar195._8_4_;
    fVar365 = fVar182 * auVar101._8_4_ * 3.0;
    auVar31._8_4_ = fVar365;
    fVar280 = auVar195._12_4_;
    fVar366 = fVar280 * auVar101._12_4_ * 3.0;
    auVar31._12_4_ = fVar366;
    fVar367 = fVar233 * auVar101._16_4_ * 3.0;
    auVar31._16_4_ = fVar367;
    fVar368 = fVar234 * auVar101._20_4_ * 3.0;
    auVar31._20_4_ = fVar368;
    fVar369 = fVar182 * auVar101._24_4_ * 3.0;
    auVar31._24_4_ = fVar369;
    auVar31._28_4_ = fVar370;
    fVar343 = fVar233 * auVar225._0_4_ * 3.0;
    fVar353 = fVar234 * auVar225._4_4_ * 3.0;
    local_9a0._4_4_ = fVar353;
    local_9a0._0_4_ = fVar343;
    fVar354 = fVar182 * auVar225._8_4_ * 3.0;
    local_9a0._8_4_ = fVar354;
    fVar355 = fVar280 * auVar225._12_4_ * 3.0;
    local_9a0._12_4_ = fVar355;
    fVar356 = fVar233 * auVar225._16_4_ * 3.0;
    local_9a0._16_4_ = fVar356;
    fVar357 = fVar234 * auVar225._20_4_ * 3.0;
    local_9a0._20_4_ = fVar357;
    fVar358 = fVar182 * auVar225._24_4_ * 3.0;
    local_9a0._24_4_ = fVar358;
    local_9a0._28_4_ = auVar347._28_4_;
    fVar371 = fVar233 * auVar102._0_4_ * 3.0;
    fVar377 = fVar234 * auVar102._4_4_ * 3.0;
    auVar226._4_4_ = fVar377;
    auVar226._0_4_ = fVar371;
    fVar379 = fVar182 * auVar102._8_4_ * 3.0;
    auVar226._8_4_ = fVar379;
    fVar381 = fVar280 * auVar102._12_4_ * 3.0;
    auVar226._12_4_ = fVar381;
    fVar383 = fVar233 * auVar102._16_4_ * 3.0;
    auVar226._16_4_ = fVar383;
    fVar385 = fVar234 * auVar102._20_4_ * 3.0;
    auVar226._20_4_ = fVar385;
    fVar387 = fVar182 * auVar102._24_4_ * 3.0;
    auVar226._24_4_ = fVar387;
    auVar226._28_4_ = fVar389;
    fVar336 = fVar233 * auVar351._0_4_ * 3.0;
    fVar338 = fVar234 * auVar351._4_4_ * 3.0;
    auVar26._4_4_ = fVar338;
    auVar26._0_4_ = fVar336;
    fVar264 = fVar182 * auVar351._8_4_ * 3.0;
    auVar26._8_4_ = fVar264;
    fVar280 = fVar280 * auVar351._12_4_ * 3.0;
    auVar26._12_4_ = fVar280;
    fVar233 = fVar233 * auVar351._16_4_ * 3.0;
    auVar26._16_4_ = fVar233;
    fVar234 = fVar234 * auVar351._20_4_ * 3.0;
    auVar26._20_4_ = fVar234;
    fVar182 = fVar182 * auVar351._24_4_ * 3.0;
    auVar26._24_4_ = fVar182;
    auVar26._28_4_ = auVar225._28_4_;
    auVar101 = vperm2f128_avx(auVar391,auVar391,1);
    auVar101 = vshufps_avx(auVar101,auVar391,0x30);
    auVar103 = vshufps_avx(auVar391,auVar101,0x29);
    auVar101 = vperm2f128_avx(local_2e0,local_2e0,1);
    auVar101 = vshufps_avx(auVar101,local_2e0,0x30);
    auVar139 = vshufps_avx(local_2e0,auVar101,0x29);
    auVar102 = vsubps_avx(auVar274,auVar26);
    auVar101 = vperm2f128_avx(auVar102,auVar102,1);
    auVar101 = vshufps_avx(auVar101,auVar102,0x30);
    auVar26 = vshufps_avx(auVar102,auVar101,0x29);
    auVar204 = vsubps_avx(auVar103,auVar391);
    local_300 = vsubps_avx(auVar139,local_2e0);
    fVar319 = auVar204._0_4_;
    fVar149 = auVar204._4_4_;
    auVar27._4_4_ = fVar377 * fVar149;
    auVar27._0_4_ = fVar371 * fVar319;
    fVar284 = auVar204._8_4_;
    auVar27._8_4_ = fVar379 * fVar284;
    fVar235 = auVar204._12_4_;
    auVar27._12_4_ = fVar381 * fVar235;
    fVar258 = auVar204._16_4_;
    auVar27._16_4_ = fVar383 * fVar258;
    fVar265 = auVar204._20_4_;
    auVar27._20_4_ = fVar385 * fVar265;
    fVar298 = auVar204._24_4_;
    auVar27._24_4_ = fVar387 * fVar298;
    auVar27._28_4_ = auVar102._28_4_;
    fVar320 = local_300._0_4_;
    fVar185 = local_300._4_4_;
    auVar28._4_4_ = fVar353 * fVar185;
    auVar28._0_4_ = fVar343 * fVar320;
    fVar288 = local_300._8_4_;
    auVar28._8_4_ = fVar354 * fVar288;
    fVar236 = local_300._12_4_;
    auVar28._12_4_ = fVar355 * fVar236;
    fVar259 = local_300._16_4_;
    auVar28._16_4_ = fVar356 * fVar259;
    fVar281 = local_300._20_4_;
    auVar28._20_4_ = fVar357 * fVar281;
    fVar18 = local_300._24_4_;
    auVar28._24_4_ = fVar358 * fVar18;
    auVar28._28_4_ = auVar101._28_4_;
    auVar28 = vsubps_avx(auVar28,auVar27);
    auVar72._4_4_ = fVar282;
    auVar72._0_4_ = fVar266;
    auVar72._8_4_ = fVar286;
    auVar72._12_4_ = fVar290;
    auVar72._16_4_ = fVar293;
    auVar72._20_4_ = fVar296;
    auVar72._24_4_ = fVar299;
    auVar72._28_4_ = fVar301;
    auVar101 = vperm2f128_avx(auVar72,auVar72,1);
    auVar101 = vshufps_avx(auVar101,auVar72,0x30);
    auVar27 = vshufps_avx(auVar72,auVar101,0x29);
    local_540 = vsubps_avx(auVar27,auVar72);
    auVar29._4_4_ = fVar364 * fVar185;
    auVar29._0_4_ = fVar359 * fVar320;
    auVar29._8_4_ = fVar365 * fVar288;
    auVar29._12_4_ = fVar366 * fVar236;
    auVar29._16_4_ = fVar367 * fVar259;
    auVar29._20_4_ = fVar368 * fVar281;
    auVar29._24_4_ = fVar369 * fVar18;
    auVar29._28_4_ = auVar27._28_4_;
    fVar327 = local_540._0_4_;
    fVar208 = local_540._4_4_;
    auVar30._4_4_ = fVar377 * fVar208;
    auVar30._0_4_ = fVar371 * fVar327;
    fVar210 = local_540._8_4_;
    auVar30._8_4_ = fVar379 * fVar210;
    fVar237 = local_540._12_4_;
    auVar30._12_4_ = fVar381 * fVar237;
    fVar260 = local_540._16_4_;
    auVar30._16_4_ = fVar383 * fVar260;
    fVar285 = local_540._20_4_;
    auVar30._20_4_ = fVar385 * fVar285;
    fVar19 = local_540._24_4_;
    auVar30._24_4_ = fVar387 * fVar19;
    auVar30._28_4_ = auVar314._28_4_;
    auVar29 = vsubps_avx(auVar30,auVar29);
    auVar376._4_4_ = fVar353 * fVar208;
    auVar376._0_4_ = fVar343 * fVar327;
    auVar376._8_4_ = fVar354 * fVar210;
    auVar376._12_4_ = fVar355 * fVar237;
    auVar376._16_4_ = fVar356 * fVar260;
    auVar376._20_4_ = fVar357 * fVar285;
    auVar376._24_4_ = fVar358 * fVar19;
    auVar376._28_4_ = auVar314._28_4_;
    auVar32._4_4_ = fVar364 * fVar149;
    auVar32._0_4_ = fVar359 * fVar319;
    auVar32._8_4_ = fVar365 * fVar284;
    auVar32._12_4_ = fVar366 * fVar235;
    auVar32._16_4_ = fVar367 * fVar258;
    auVar32._20_4_ = fVar368 * fVar265;
    auVar32._24_4_ = fVar369 * fVar298;
    auVar32._28_4_ = auVar331._28_4_;
    auVar30 = vsubps_avx(auVar32,auVar376);
    fVar318 = auVar30._28_4_;
    auVar205._0_4_ = fVar327 * fVar327 + fVar319 * fVar319 + fVar320 * fVar320;
    auVar205._4_4_ = fVar208 * fVar208 + fVar149 * fVar149 + fVar185 * fVar185;
    auVar205._8_4_ = fVar210 * fVar210 + fVar284 * fVar284 + fVar288 * fVar288;
    auVar205._12_4_ = fVar237 * fVar237 + fVar235 * fVar235 + fVar236 * fVar236;
    auVar205._16_4_ = fVar260 * fVar260 + fVar258 * fVar258 + fVar259 * fVar259;
    auVar205._20_4_ = fVar285 * fVar285 + fVar265 * fVar265 + fVar281 * fVar281;
    auVar205._24_4_ = fVar19 * fVar19 + fVar298 * fVar298 + fVar18 * fVar18;
    auVar205._28_4_ = fVar318 + fVar318 + auVar28._28_4_;
    auVar101 = vrcpps_avx(auVar205);
    fVar239 = auVar101._0_4_;
    fVar262 = auVar101._4_4_;
    auVar33._4_4_ = fVar262 * auVar205._4_4_;
    auVar33._0_4_ = fVar239 * auVar205._0_4_;
    fVar263 = auVar101._8_4_;
    auVar33._8_4_ = fVar263 * auVar205._8_4_;
    fVar292 = auVar101._12_4_;
    auVar33._12_4_ = fVar292 * auVar205._12_4_;
    fVar295 = auVar101._16_4_;
    auVar33._16_4_ = fVar295 * auVar205._16_4_;
    fVar321 = auVar101._20_4_;
    auVar33._20_4_ = fVar321 * auVar205._20_4_;
    fVar322 = auVar101._24_4_;
    auVar33._24_4_ = fVar322 * auVar205._24_4_;
    auVar33._28_4_ = auVar331._28_4_;
    auVar104._8_4_ = 0x3f800000;
    auVar104._0_8_ = 0x3f8000003f800000;
    auVar104._12_4_ = 0x3f800000;
    auVar104._16_4_ = 0x3f800000;
    auVar104._20_4_ = 0x3f800000;
    auVar104._24_4_ = 0x3f800000;
    auVar104._28_4_ = 0x3f800000;
    auVar376 = vsubps_avx(auVar104,auVar33);
    fVar239 = fVar239 + fVar239 * auVar376._0_4_;
    fVar262 = fVar262 + fVar262 * auVar376._4_4_;
    fVar263 = fVar263 + fVar263 * auVar376._8_4_;
    fVar292 = fVar292 + fVar292 * auVar376._12_4_;
    fVar295 = fVar295 + fVar295 * auVar376._16_4_;
    fVar321 = fVar321 + fVar321 * auVar376._20_4_;
    fVar322 = fVar322 + fVar322 * auVar376._24_4_;
    auVar102 = vperm2f128_avx(local_9a0,local_9a0,1);
    auVar102 = vshufps_avx(auVar102,local_9a0,0x30);
    auVar102 = vshufps_avx(local_9a0,auVar102,0x29);
    auVar351 = vperm2f128_avx(auVar226,auVar226,1);
    auVar351 = vshufps_avx(auVar351,auVar226,0x30);
    local_980 = vshufps_avx(auVar226,auVar351,0x29);
    fVar88 = local_980._0_4_;
    fVar117 = local_980._4_4_;
    auVar34._4_4_ = fVar117 * fVar149;
    auVar34._0_4_ = fVar88 * fVar319;
    fVar119 = local_980._8_4_;
    auVar34._8_4_ = fVar119 * fVar284;
    fVar121 = local_980._12_4_;
    auVar34._12_4_ = fVar121 * fVar235;
    fVar122 = local_980._16_4_;
    auVar34._16_4_ = fVar122 * fVar258;
    fVar123 = local_980._20_4_;
    auVar34._20_4_ = fVar123 * fVar265;
    fVar124 = local_980._24_4_;
    auVar34._24_4_ = fVar124 * fVar298;
    auVar34._28_4_ = auVar351._28_4_;
    fVar334 = auVar102._0_4_;
    fVar209 = auVar102._4_4_;
    auVar35._4_4_ = fVar185 * fVar209;
    auVar35._0_4_ = fVar320 * fVar334;
    fVar211 = auVar102._8_4_;
    auVar35._8_4_ = fVar288 * fVar211;
    fVar238 = auVar102._12_4_;
    auVar35._12_4_ = fVar236 * fVar238;
    fVar261 = auVar102._16_4_;
    auVar35._16_4_ = fVar259 * fVar261;
    fVar289 = auVar102._20_4_;
    auVar35._20_4_ = fVar281 * fVar289;
    fVar20 = auVar102._24_4_;
    auVar35._24_4_ = fVar18 * fVar20;
    auVar35._28_4_ = auVar347._28_4_;
    auVar351 = vsubps_avx(auVar35,auVar34);
    auVar102 = vperm2f128_avx(auVar31,auVar31,1);
    auVar102 = vshufps_avx(auVar102,auVar31,0x30);
    local_ae0 = vshufps_avx(auVar31,auVar102,0x29);
    fVar372 = local_ae0._0_4_;
    fVar378 = local_ae0._4_4_;
    auVar36._4_4_ = fVar378 * fVar185;
    auVar36._0_4_ = fVar372 * fVar320;
    fVar380 = local_ae0._8_4_;
    auVar36._8_4_ = fVar380 * fVar288;
    fVar382 = local_ae0._12_4_;
    auVar36._12_4_ = fVar382 * fVar236;
    fVar384 = local_ae0._16_4_;
    auVar36._16_4_ = fVar384 * fVar259;
    fVar386 = local_ae0._20_4_;
    auVar36._20_4_ = fVar386 * fVar281;
    fVar388 = local_ae0._24_4_;
    auVar36._24_4_ = fVar388 * fVar18;
    auVar36._28_4_ = auVar102._28_4_;
    auVar37._4_4_ = fVar208 * fVar117;
    auVar37._0_4_ = fVar327 * fVar88;
    auVar37._8_4_ = fVar210 * fVar119;
    auVar37._12_4_ = fVar237 * fVar121;
    auVar37._16_4_ = fVar260 * fVar122;
    auVar37._20_4_ = fVar285 * fVar123;
    auVar37._24_4_ = fVar19 * fVar124;
    auVar37._28_4_ = fVar370;
    auVar102 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar208 * fVar209;
    auVar38._0_4_ = fVar327 * fVar334;
    auVar38._8_4_ = fVar210 * fVar211;
    auVar38._12_4_ = fVar237 * fVar238;
    auVar38._16_4_ = fVar260 * fVar261;
    auVar38._20_4_ = fVar285 * fVar289;
    auVar38._24_4_ = fVar19 * fVar20;
    auVar38._28_4_ = fVar370;
    auVar39._4_4_ = fVar378 * fVar149;
    auVar39._0_4_ = fVar372 * fVar319;
    auVar39._8_4_ = fVar380 * fVar284;
    auVar39._12_4_ = fVar382 * fVar235;
    auVar39._16_4_ = fVar384 * fVar258;
    auVar39._20_4_ = fVar386 * fVar265;
    fVar370 = local_ae0._28_4_;
    auVar39._24_4_ = fVar388 * fVar298;
    auVar39._28_4_ = fVar370;
    auVar31 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ =
         fVar262 * (auVar28._4_4_ * auVar28._4_4_ +
                   auVar30._4_4_ * auVar30._4_4_ + auVar29._4_4_ * auVar29._4_4_);
    auVar40._0_4_ =
         fVar239 * (auVar28._0_4_ * auVar28._0_4_ +
                   auVar30._0_4_ * auVar30._0_4_ + auVar29._0_4_ * auVar29._0_4_);
    auVar40._8_4_ =
         fVar263 * (auVar28._8_4_ * auVar28._8_4_ +
                   auVar30._8_4_ * auVar30._8_4_ + auVar29._8_4_ * auVar29._8_4_);
    auVar40._12_4_ =
         fVar292 * (auVar28._12_4_ * auVar28._12_4_ +
                   auVar30._12_4_ * auVar30._12_4_ + auVar29._12_4_ * auVar29._12_4_);
    auVar40._16_4_ =
         fVar295 * (auVar28._16_4_ * auVar28._16_4_ +
                   auVar30._16_4_ * auVar30._16_4_ + auVar29._16_4_ * auVar29._16_4_);
    auVar40._20_4_ =
         fVar321 * (auVar28._20_4_ * auVar28._20_4_ +
                   auVar30._20_4_ * auVar30._20_4_ + auVar29._20_4_ * auVar29._20_4_);
    auVar40._24_4_ =
         fVar322 * (auVar28._24_4_ * auVar28._24_4_ +
                   auVar30._24_4_ * auVar30._24_4_ + auVar29._24_4_ * auVar29._24_4_);
    auVar40._28_4_ = auVar28._28_4_ + fVar318 + auVar29._28_4_;
    auVar41._4_4_ =
         (auVar351._4_4_ * auVar351._4_4_ +
         auVar102._4_4_ * auVar102._4_4_ + auVar31._4_4_ * auVar31._4_4_) * fVar262;
    auVar41._0_4_ =
         (auVar351._0_4_ * auVar351._0_4_ +
         auVar102._0_4_ * auVar102._0_4_ + auVar31._0_4_ * auVar31._0_4_) * fVar239;
    auVar41._8_4_ =
         (auVar351._8_4_ * auVar351._8_4_ +
         auVar102._8_4_ * auVar102._8_4_ + auVar31._8_4_ * auVar31._8_4_) * fVar263;
    auVar41._12_4_ =
         (auVar351._12_4_ * auVar351._12_4_ +
         auVar102._12_4_ * auVar102._12_4_ + auVar31._12_4_ * auVar31._12_4_) * fVar292;
    auVar41._16_4_ =
         (auVar351._16_4_ * auVar351._16_4_ +
         auVar102._16_4_ * auVar102._16_4_ + auVar31._16_4_ * auVar31._16_4_) * fVar295;
    auVar41._20_4_ =
         (auVar351._20_4_ * auVar351._20_4_ +
         auVar102._20_4_ * auVar102._20_4_ + auVar31._20_4_ * auVar31._20_4_) * fVar321;
    auVar41._24_4_ =
         (auVar351._24_4_ * auVar351._24_4_ +
         auVar102._24_4_ * auVar102._24_4_ + auVar31._24_4_ * auVar31._24_4_) * fVar322;
    auVar41._28_4_ = auVar101._28_4_ + auVar376._28_4_;
    auVar101 = vmaxps_avx(auVar40,auVar41);
    auVar102 = vperm2f128_avx(auVar274,auVar274,1);
    auVar102 = vshufps_avx(auVar102,auVar274,0x30);
    auVar28 = vshufps_avx(auVar274,auVar102,0x29);
    auVar164._0_4_ = auVar274._0_4_ + fVar336;
    auVar164._4_4_ = auVar274._4_4_ + fVar338;
    auVar164._8_4_ = auVar274._8_4_ + fVar264;
    auVar164._12_4_ = auVar274._12_4_ + fVar280;
    auVar164._16_4_ = auVar274._16_4_ + fVar233;
    auVar164._20_4_ = auVar274._20_4_ + fVar234;
    auVar164._24_4_ = auVar274._24_4_ + fVar182;
    auVar164._28_4_ = auVar274._28_4_ + auVar225._28_4_;
    auVar102 = vmaxps_avx(auVar274,auVar164);
    auVar351 = vmaxps_avx(auVar26,auVar28);
    auVar102 = vmaxps_avx(auVar102,auVar351);
    auVar351 = vrsqrtps_avx(auVar205);
    fVar318 = auVar351._0_4_;
    fVar336 = auVar351._4_4_;
    fVar338 = auVar351._8_4_;
    fVar264 = auVar351._12_4_;
    fVar280 = auVar351._16_4_;
    fVar233 = auVar351._20_4_;
    fVar234 = auVar351._24_4_;
    local_5e0 = fVar318 * 1.5 + fVar318 * fVar318 * fVar318 * auVar205._0_4_ * -0.5;
    fStack_5dc = fVar336 * 1.5 + fVar336 * fVar336 * fVar336 * auVar205._4_4_ * -0.5;
    fStack_5d8 = fVar338 * 1.5 + fVar338 * fVar338 * fVar338 * auVar205._8_4_ * -0.5;
    fStack_5d4 = fVar264 * 1.5 + fVar264 * fVar264 * fVar264 * auVar205._12_4_ * -0.5;
    fStack_5d0 = fVar280 * 1.5 + fVar280 * fVar280 * fVar280 * auVar205._16_4_ * -0.5;
    fStack_5cc = fVar233 * 1.5 + fVar233 * fVar233 * fVar233 * auVar205._20_4_ * -0.5;
    fStack_5c8 = fVar234 * 1.5 + fVar234 * fVar234 * fVar234 * auVar205._24_4_ * -0.5;
    auVar225 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_a60 = vsubps_avx(auVar225,auVar391);
    auVar225 = vsubps_avx(auVar225,local_2e0);
    fVar328 = auVar225._0_4_;
    fVar335 = auVar225._4_4_;
    fVar337 = auVar225._8_4_;
    fVar339 = auVar225._12_4_;
    fVar340 = auVar225._16_4_;
    fVar341 = auVar225._20_4_;
    fVar342 = auVar225._24_4_;
    fVar336 = local_a60._0_4_;
    fVar264 = local_a60._4_4_;
    fVar233 = local_a60._8_4_;
    fVar182 = local_a60._12_4_;
    fVar262 = local_a60._16_4_;
    fVar292 = local_a60._20_4_;
    fVar321 = local_a60._24_4_;
    auVar73._4_4_ = fVar282;
    auVar73._0_4_ = fVar266;
    auVar73._8_4_ = fVar286;
    auVar73._12_4_ = fVar290;
    auVar73._16_4_ = fVar293;
    auVar73._20_4_ = fVar296;
    auVar73._24_4_ = fVar299;
    auVar73._28_4_ = fVar301;
    auVar226 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar225 = vsubps_avx(auVar226,auVar73);
    fVar338 = auVar225._0_4_;
    fVar280 = auVar225._4_4_;
    fVar234 = auVar225._8_4_;
    fVar239 = auVar225._12_4_;
    fVar263 = auVar225._16_4_;
    fVar295 = auVar225._20_4_;
    fVar322 = auVar225._24_4_;
    auVar362._0_4_ =
         (float)local_a80._0_4_ * fVar338 +
         (float)local_7e0._0_4_ * fVar336 + fVar328 * (float)local_900._0_4_;
    auVar362._4_4_ =
         (float)local_a80._4_4_ * fVar280 +
         (float)local_7e0._4_4_ * fVar264 + fVar335 * (float)local_900._4_4_;
    auVar362._8_4_ = fStack_a78 * fVar234 + fStack_7d8 * fVar233 + fVar337 * fStack_8f8;
    auVar362._12_4_ = fStack_a74 * fVar239 + fStack_7d4 * fVar182 + fVar339 * fStack_8f4;
    auVar362._16_4_ = fStack_a70 * fVar263 + fStack_7d0 * fVar262 + fVar340 * fStack_8f0;
    auVar362._20_4_ = fStack_a6c * fVar295 + fStack_7cc * fVar292 + fVar341 * fStack_8ec;
    auVar362._24_4_ = fStack_a68 * fVar322 + fStack_7c8 * fVar321 + fVar342 * fStack_8e8;
    auVar362._28_4_ = fVar370 + auVar31._28_4_ + auVar205._28_4_;
    auVar374._0_4_ = fVar338 * fVar338 + fVar336 * fVar336 + fVar328 * fVar328;
    auVar374._4_4_ = fVar280 * fVar280 + fVar264 * fVar264 + fVar335 * fVar335;
    auVar374._8_4_ = fVar234 * fVar234 + fVar233 * fVar233 + fVar337 * fVar337;
    auVar374._12_4_ = fVar239 * fVar239 + fVar182 * fVar182 + fVar339 * fVar339;
    auVar374._16_4_ = fVar263 * fVar263 + fVar262 * fVar262 + fVar340 * fVar340;
    auVar374._20_4_ = fVar295 * fVar295 + fVar292 * fVar292 + fVar341 * fVar341;
    auVar374._24_4_ = fVar322 * fVar322 + fVar321 * fVar321 + fVar342 * fVar342;
    auVar374._28_4_ = local_2e0._28_4_ + local_2e0._28_4_ + fVar370;
    local_560 = (float)local_a80._0_4_ * fVar327 * local_5e0 +
                local_5e0 * fVar319 * (float)local_7e0._0_4_ +
                fVar320 * local_5e0 * (float)local_900._0_4_;
    fStack_55c = (float)local_a80._4_4_ * fVar208 * fStack_5dc +
                 fStack_5dc * fVar149 * (float)local_7e0._4_4_ +
                 fVar185 * fStack_5dc * (float)local_900._4_4_;
    fStack_558 = fStack_a78 * fVar210 * fStack_5d8 +
                 fStack_5d8 * fVar284 * fStack_7d8 + fVar288 * fStack_5d8 * fStack_8f8;
    fStack_554 = fStack_a74 * fVar237 * fStack_5d4 +
                 fStack_5d4 * fVar235 * fStack_7d4 + fVar236 * fStack_5d4 * fStack_8f4;
    fStack_550 = fStack_a70 * fVar260 * fStack_5d0 +
                 fStack_5d0 * fVar258 * fStack_7d0 + fVar259 * fStack_5d0 * fStack_8f0;
    fStack_54c = fStack_a6c * fVar285 * fStack_5cc +
                 fStack_5cc * fVar265 * fStack_7cc + fVar281 * fStack_5cc * fStack_8ec;
    fStack_548 = fStack_a68 * fVar19 * fStack_5c8 +
                 fStack_5c8 * fVar298 * fStack_7c8 + fVar18 * fStack_5c8 * fStack_8e8;
    fVar318 = fStack_a64 + fStack_7c4 + fStack_8e4;
    local_600 = fVar338 * fVar327 * local_5e0 +
                local_5e0 * fVar319 * fVar336 + fVar328 * fVar320 * local_5e0;
    fStack_5fc = fVar280 * fVar208 * fStack_5dc +
                 fStack_5dc * fVar149 * fVar264 + fVar335 * fVar185 * fStack_5dc;
    fStack_5f8 = fVar234 * fVar210 * fStack_5d8 +
                 fStack_5d8 * fVar284 * fVar233 + fVar337 * fVar288 * fStack_5d8;
    fStack_5f4 = fVar239 * fVar237 * fStack_5d4 +
                 fStack_5d4 * fVar235 * fVar182 + fVar339 * fVar236 * fStack_5d4;
    fStack_5f0 = fVar263 * fVar260 * fStack_5d0 +
                 fStack_5d0 * fVar258 * fVar262 + fVar340 * fVar259 * fStack_5d0;
    fStack_5ec = fVar295 * fVar285 * fStack_5cc +
                 fStack_5cc * fVar265 * fVar292 + fVar341 * fVar281 * fStack_5cc;
    fStack_5e8 = fVar322 * fVar19 * fStack_5c8 +
                 fStack_5c8 * fVar298 * fVar321 + fVar342 * fVar18 * fStack_5c8;
    fStack_5e4 = fStack_7c4 + fVar318;
    auVar225._4_4_ = fStack_55c * fStack_5fc;
    auVar225._0_4_ = local_560 * local_600;
    auVar225._8_4_ = fStack_558 * fStack_5f8;
    auVar225._12_4_ = fStack_554 * fStack_5f4;
    auVar225._16_4_ = fStack_550 * fStack_5f0;
    auVar225._20_4_ = fStack_54c * fStack_5ec;
    auVar225._24_4_ = fStack_548 * fStack_5e8;
    auVar225._28_4_ = fVar318;
    auVar29 = vsubps_avx(auVar362,auVar225);
    auVar42._4_4_ = fStack_5fc * fStack_5fc;
    auVar42._0_4_ = local_600 * local_600;
    auVar42._8_4_ = fStack_5f8 * fStack_5f8;
    auVar42._12_4_ = fStack_5f4 * fStack_5f4;
    auVar42._16_4_ = fStack_5f0 * fStack_5f0;
    auVar42._20_4_ = fStack_5ec * fStack_5ec;
    auVar42._24_4_ = fStack_5e8 * fStack_5e8;
    auVar42._28_4_ = fStack_7c4;
    auVar30 = vsubps_avx(auVar374,auVar42);
    auVar225 = vsqrtps_avx(auVar101);
    fVar318 = (auVar225._0_4_ + auVar102._0_4_) * 1.0000002;
    fVar370 = (auVar225._4_4_ + auVar102._4_4_) * 1.0000002;
    fVar174 = (auVar225._8_4_ + auVar102._8_4_) * 1.0000002;
    fVar176 = (auVar225._12_4_ + auVar102._12_4_) * 1.0000002;
    fVar178 = (auVar225._16_4_ + auVar102._16_4_) * 1.0000002;
    fVar180 = (auVar225._20_4_ + auVar102._20_4_) * 1.0000002;
    fVar183 = (auVar225._24_4_ + auVar102._24_4_) * 1.0000002;
    auVar43._4_4_ = fVar370 * fVar370;
    auVar43._0_4_ = fVar318 * fVar318;
    auVar43._8_4_ = fVar174 * fVar174;
    auVar43._12_4_ = fVar176 * fVar176;
    auVar43._16_4_ = fVar178 * fVar178;
    auVar43._20_4_ = fVar180 * fVar180;
    auVar43._24_4_ = fVar183 * fVar183;
    auVar43._28_4_ = auVar225._28_4_ + auVar102._28_4_;
    local_a00._0_4_ = auVar29._0_4_ + auVar29._0_4_;
    local_a00._4_4_ = auVar29._4_4_ + auVar29._4_4_;
    local_a00._8_4_ = auVar29._8_4_ + auVar29._8_4_;
    local_a00._12_4_ = auVar29._12_4_ + auVar29._12_4_;
    local_a00._16_4_ = auVar29._16_4_ + auVar29._16_4_;
    local_a00._20_4_ = auVar29._20_4_ + auVar29._20_4_;
    local_a00._24_4_ = auVar29._24_4_ + auVar29._24_4_;
    fVar318 = auVar29._28_4_;
    local_a00._28_4_ = fVar318 + fVar318;
    auVar102 = vsubps_avx(auVar30,auVar43);
    auVar44._4_4_ = fStack_55c * fStack_55c;
    auVar44._0_4_ = local_560 * local_560;
    auVar44._8_4_ = fStack_558 * fStack_558;
    auVar44._12_4_ = fStack_554 * fStack_554;
    auVar44._16_4_ = fStack_550 * fStack_550;
    auVar44._20_4_ = fStack_54c * fStack_54c;
    auVar44._24_4_ = fStack_548 * fStack_548;
    auVar44._28_4_ = fVar318;
    auVar29 = vsubps_avx(local_2c0,auVar44);
    auVar45._4_4_ = local_a00._4_4_ * local_a00._4_4_;
    auVar45._0_4_ = (float)local_a00._0_4_ * (float)local_a00._0_4_;
    auVar45._8_4_ = local_a00._8_4_ * local_a00._8_4_;
    auVar45._12_4_ = local_a00._12_4_ * local_a00._12_4_;
    auVar45._16_4_ = local_a00._16_4_ * local_a00._16_4_;
    auVar45._20_4_ = local_a00._20_4_ * local_a00._20_4_;
    auVar45._24_4_ = local_a00._24_4_ * local_a00._24_4_;
    auVar45._28_4_ = local_2c0._28_4_;
    fVar318 = auVar29._0_4_;
    fVar370 = auVar29._4_4_;
    fVar174 = auVar29._8_4_;
    fVar176 = auVar29._12_4_;
    fVar178 = auVar29._16_4_;
    fVar180 = auVar29._20_4_;
    fVar183 = auVar29._24_4_;
    auVar46._4_4_ = auVar102._4_4_ * fVar370 * 4.0;
    auVar46._0_4_ = auVar102._0_4_ * fVar318 * 4.0;
    auVar46._8_4_ = auVar102._8_4_ * fVar174 * 4.0;
    auVar46._12_4_ = auVar102._12_4_ * fVar176 * 4.0;
    auVar46._16_4_ = auVar102._16_4_ * fVar178 * 4.0;
    auVar46._20_4_ = auVar102._20_4_ * fVar180 * 4.0;
    auVar46._24_4_ = auVar102._24_4_ * fVar183 * 4.0;
    auVar46._28_4_ = 0x40800000;
    auVar376 = vsubps_avx(auVar45,auVar46);
    auVar101 = vcmpps_avx(auVar376,auVar226,5);
    auVar232 = ZEXT3264(auVar101);
    auVar306._8_4_ = 0x7fffffff;
    auVar306._0_8_ = 0x7fffffff7fffffff;
    auVar306._12_4_ = 0x7fffffff;
    auVar306._16_4_ = 0x7fffffff;
    auVar306._20_4_ = 0x7fffffff;
    auVar306._24_4_ = 0x7fffffff;
    auVar306._28_4_ = 0x7fffffff;
    local_440 = vandps_avx(auVar44,auVar306);
    local_340._0_4_ = fVar318 + fVar318;
    local_340._4_4_ = fVar370 + fVar370;
    local_340._8_4_ = fVar174 + fVar174;
    local_340._12_4_ = fVar176 + fVar176;
    local_340._16_4_ = fVar178 + fVar178;
    local_340._20_4_ = fVar180 + fVar180;
    local_340._24_4_ = fVar183 + fVar183;
    local_340._28_4_ = auVar29._28_4_ + auVar29._28_4_;
    local_9e0 = vandps_avx(auVar29,auVar306);
    uVar79 = CONCAT44(local_a00._4_4_,local_a00._0_4_);
    local_320._0_8_ = uVar79 ^ 0x8000000080000000;
    local_320._8_4_ = -local_a00._8_4_;
    local_320._12_4_ = -local_a00._12_4_;
    local_320._16_4_ = -local_a00._16_4_;
    local_320._20_4_ = -local_a00._20_4_;
    local_320._24_4_ = -local_a00._24_4_;
    local_320._28_4_ = -local_a00._28_4_;
    fStack_544 = fStack_a64 + fStack_7c4 + fStack_8e4;
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0x7f,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0xbf,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f])
    {
      auVar392._8_4_ = 0x7f800000;
      auVar392._0_8_ = 0x7f8000007f800000;
      auVar392._12_4_ = 0x7f800000;
      auVar392._16_4_ = 0x7f800000;
      auVar392._20_4_ = 0x7f800000;
      auVar392._24_4_ = 0x7f800000;
      auVar392._28_4_ = 0x7f800000;
      auVar165._8_4_ = 0xff800000;
      auVar165._0_8_ = 0xff800000ff800000;
      auVar165._12_4_ = 0xff800000;
      auVar165._16_4_ = 0xff800000;
      auVar165._20_4_ = 0xff800000;
      auVar165._24_4_ = 0xff800000;
      auVar165._28_4_ = 0xff800000;
    }
    else {
      auVar31 = vsqrtps_avx(auVar376);
      auVar29 = vrcpps_avx(local_340);
      auVar101 = vcmpps_avx(auVar376,auVar226,5);
      fVar153 = auVar29._0_4_;
      fVar173 = auVar29._4_4_;
      auVar47._4_4_ = local_340._4_4_ * fVar173;
      auVar47._0_4_ = local_340._0_4_ * fVar153;
      fVar175 = auVar29._8_4_;
      auVar47._8_4_ = local_340._8_4_ * fVar175;
      fVar177 = auVar29._12_4_;
      auVar47._12_4_ = local_340._12_4_ * fVar177;
      fVar179 = auVar29._16_4_;
      auVar47._16_4_ = local_340._16_4_ * fVar179;
      fVar181 = auVar29._20_4_;
      auVar47._20_4_ = local_340._20_4_ * fVar181;
      fVar184 = auVar29._24_4_;
      auVar47._24_4_ = local_340._24_4_ * fVar184;
      auVar47._28_4_ = auVar376._28_4_;
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = 0x3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar105._16_4_ = 0x3f800000;
      auVar105._20_4_ = 0x3f800000;
      auVar105._24_4_ = 0x3f800000;
      auVar105._28_4_ = 0x3f800000;
      auVar376 = vsubps_avx(auVar105,auVar47);
      fVar153 = fVar153 + fVar153 * auVar376._0_4_;
      fVar173 = fVar173 + fVar173 * auVar376._4_4_;
      fVar175 = fVar175 + fVar175 * auVar376._8_4_;
      fVar177 = fVar177 + fVar177 * auVar376._12_4_;
      fVar179 = fVar179 + fVar179 * auVar376._16_4_;
      fVar181 = fVar181 + fVar181 * auVar376._20_4_;
      fVar184 = fVar184 + fVar184 * auVar376._24_4_;
      auVar226 = vsubps_avx(local_320,auVar31);
      fVar267 = auVar226._0_4_ * fVar153;
      fVar283 = auVar226._4_4_ * fVar173;
      auVar48._4_4_ = fVar283;
      auVar48._0_4_ = fVar267;
      fVar287 = auVar226._8_4_ * fVar175;
      auVar48._8_4_ = fVar287;
      fVar291 = auVar226._12_4_ * fVar177;
      auVar48._12_4_ = fVar291;
      fVar294 = auVar226._16_4_ * fVar179;
      auVar48._16_4_ = fVar294;
      fVar297 = auVar226._20_4_ * fVar181;
      auVar48._20_4_ = fVar297;
      fVar300 = auVar226._24_4_ * fVar184;
      auVar48._24_4_ = fVar300;
      auVar48._28_4_ = auVar226._28_4_;
      auVar31 = vsubps_avx(auVar31,local_a00);
      fVar153 = auVar31._0_4_ * fVar153;
      fVar173 = auVar31._4_4_ * fVar173;
      auVar49._4_4_ = fVar173;
      auVar49._0_4_ = fVar153;
      fVar175 = auVar31._8_4_ * fVar175;
      auVar49._8_4_ = fVar175;
      fVar177 = auVar31._12_4_ * fVar177;
      auVar49._12_4_ = fVar177;
      fVar179 = auVar31._16_4_ * fVar179;
      auVar49._16_4_ = fVar179;
      fVar181 = auVar31._20_4_ * fVar181;
      auVar49._20_4_ = fVar181;
      fVar184 = auVar31._24_4_ * fVar184;
      auVar49._24_4_ = fVar184;
      auVar49._28_4_ = auVar29._28_4_ + auVar376._28_4_;
      fStack_404 = fStack_5e4 + auVar31._28_4_;
      local_420 = local_5e0 * (local_600 + local_560 * fVar267);
      fStack_41c = fStack_5dc * (fStack_5fc + fStack_55c * fVar283);
      fStack_418 = fStack_5d8 * (fStack_5f8 + fStack_558 * fVar287);
      fStack_414 = fStack_5d4 * (fStack_5f4 + fStack_554 * fVar291);
      fStack_410 = fStack_5d0 * (fStack_5f0 + fStack_550 * fVar294);
      fStack_40c = fStack_5cc * (fStack_5ec + fStack_54c * fVar297);
      fStack_408 = fStack_5c8 * (fStack_5e8 + fStack_548 * fVar300);
      local_400 = local_5e0 * (local_600 + local_560 * fVar153);
      fStack_3fc = fStack_5dc * (fStack_5fc + fStack_55c * fVar173);
      fStack_3f8 = fStack_5d8 * (fStack_5f8 + fStack_558 * fVar175);
      fStack_3f4 = fStack_5d4 * (fStack_5f4 + fStack_554 * fVar177);
      fStack_3f0 = fStack_5d0 * (fStack_5f0 + fStack_550 * fVar179);
      fStack_3ec = fStack_5cc * (fStack_5ec + fStack_54c * fVar181);
      fStack_3e8 = fStack_5c8 * (fStack_5e8 + fStack_548 * fVar184);
      fStack_3e4 = fStack_5e4 + fStack_404;
      auVar250._8_4_ = 0x7f800000;
      auVar250._0_8_ = 0x7f8000007f800000;
      auVar250._12_4_ = 0x7f800000;
      auVar250._16_4_ = 0x7f800000;
      auVar250._20_4_ = 0x7f800000;
      auVar250._24_4_ = 0x7f800000;
      auVar250._28_4_ = 0x7f800000;
      auVar392 = vblendvps_avx(auVar250,auVar48,auVar101);
      auVar251._8_4_ = 0xff800000;
      auVar251._0_8_ = 0xff800000ff800000;
      auVar251._12_4_ = 0xff800000;
      auVar251._16_4_ = 0xff800000;
      auVar251._20_4_ = 0xff800000;
      auVar251._24_4_ = 0xff800000;
      auVar251._28_4_ = 0xff800000;
      auVar165 = vblendvps_avx(auVar251,auVar49,auVar101);
      auVar29 = vmaxps_avx(local_580,local_440);
      auVar50._4_4_ = auVar29._4_4_ * 1.9073486e-06;
      auVar50._0_4_ = auVar29._0_4_ * 1.9073486e-06;
      auVar50._8_4_ = auVar29._8_4_ * 1.9073486e-06;
      auVar50._12_4_ = auVar29._12_4_ * 1.9073486e-06;
      auVar50._16_4_ = auVar29._16_4_ * 1.9073486e-06;
      auVar50._20_4_ = auVar29._20_4_ * 1.9073486e-06;
      auVar50._24_4_ = auVar29._24_4_ * 1.9073486e-06;
      auVar50._28_4_ = auVar29._28_4_;
      auVar29 = vcmpps_avx(local_9e0,auVar50,1);
      auVar376 = auVar101 & auVar29;
      if ((((((((auVar376 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar376 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar376 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar376 >> 0x7f,0) != '\0') ||
            (auVar376 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar376 >> 0xbf,0) != '\0') ||
          (auVar376 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar376[0x1f] < '\0') {
        auVar29 = vandps_avx(auVar29,auVar101);
        auVar195 = vpackssdw_avx(auVar29._0_16_,auVar29._16_16_);
        auVar376 = vcmpps_avx(auVar102,_DAT_01f7b000,2);
        auVar326._8_4_ = 0xff800000;
        auVar326._0_8_ = 0xff800000ff800000;
        auVar326._12_4_ = 0xff800000;
        auVar326._16_4_ = 0xff800000;
        auVar326._20_4_ = 0xff800000;
        auVar326._24_4_ = 0xff800000;
        auVar326._28_4_ = 0xff800000;
        auVar363._8_4_ = 0x7f800000;
        auVar363._0_8_ = 0x7f8000007f800000;
        auVar363._12_4_ = 0x7f800000;
        auVar363._16_4_ = 0x7f800000;
        auVar363._20_4_ = 0x7f800000;
        auVar363._24_4_ = 0x7f800000;
        auVar363._28_4_ = 0x7f800000;
        auVar102 = vblendvps_avx(auVar363,auVar326,auVar376);
        auVar270 = vpmovsxwd_avx(auVar195);
        auVar195 = vpunpckhwd_avx(auVar195,auVar195);
        auVar278._16_16_ = auVar195;
        auVar278._0_16_ = auVar270;
        auVar392 = vblendvps_avx(auVar392,auVar102,auVar278);
        auVar102 = vblendvps_avx(auVar326,auVar363,auVar376);
        auVar165 = vblendvps_avx(auVar165,auVar102,auVar278);
        auVar257._0_8_ = auVar29._0_8_ ^ 0xffffffffffffffff;
        auVar257._8_4_ = auVar29._8_4_ ^ 0xffffffff;
        auVar257._12_4_ = auVar29._12_4_ ^ 0xffffffff;
        auVar257._16_4_ = auVar29._16_4_ ^ 0xffffffff;
        auVar257._20_4_ = auVar29._20_4_ ^ 0xffffffff;
        auVar257._24_4_ = auVar29._24_4_ ^ 0xffffffff;
        auVar257._28_4_ = auVar29._28_4_ ^ 0xffffffff;
        auVar102 = vorps_avx(auVar376,auVar257);
        auVar101 = vandps_avx(auVar101,auVar102);
        auVar232 = ZEXT3264(auVar101);
      }
    }
    auVar101 = local_520 & auVar232._0_32_;
    auVar279 = ZEXT3264(local_9c0);
    fVar153 = (float)local_920._0_4_;
    fVar173 = (float)local_920._4_4_;
    fVar175 = fStack_918;
    fVar177 = fStack_914;
    fVar179 = fStack_910;
    fVar181 = fStack_90c;
    fVar184 = fStack_908;
    fVar267 = fStack_904;
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0x7f,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0xbf,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f])
    {
      auVar352 = ZEXT3264(local_b00);
      auVar232 = ZEXT3264(local_8c0);
      auVar333 = ZEXT3264(local_a40);
    }
    else {
      fStack_5c4 = auVar351._28_4_ + auVar205._28_4_;
      auVar317 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar195 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_960._0_4_));
      auVar195 = vshufps_avx(auVar195,auVar195,0);
      auVar252._16_16_ = auVar195;
      auVar252._0_16_ = auVar195;
      auVar29 = vminps_avx(auVar252,auVar165);
      auVar106._0_4_ =
           (float)local_a80._0_4_ * fVar359 +
           (float)local_7e0._0_4_ * fVar343 + (float)local_900._0_4_ * fVar371;
      auVar106._4_4_ =
           (float)local_a80._4_4_ * fVar364 +
           (float)local_7e0._4_4_ * fVar353 + (float)local_900._4_4_ * fVar377;
      auVar106._8_4_ = fStack_a78 * fVar365 + fStack_7d8 * fVar354 + fStack_8f8 * fVar379;
      auVar106._12_4_ = fStack_a74 * fVar366 + fStack_7d4 * fVar355 + fStack_8f4 * fVar381;
      auVar106._16_4_ = fStack_a70 * fVar367 + fStack_7d0 * fVar356 + fStack_8f0 * fVar383;
      auVar106._20_4_ = fStack_a6c * fVar368 + fStack_7cc * fVar357 + fStack_8ec * fVar385;
      auVar106._24_4_ = fStack_a68 * fVar369 + fStack_7c8 * fVar358 + fStack_8e8 * fVar387;
      auVar106._28_4_ = fVar389 + auVar347._28_4_ + fVar389;
      auVar351 = vrcpps_avx(auVar106);
      fVar389 = auVar351._0_4_;
      fVar283 = auVar351._4_4_;
      auVar51._4_4_ = auVar106._4_4_ * fVar283;
      auVar51._0_4_ = auVar106._0_4_ * fVar389;
      fVar287 = auVar351._8_4_;
      auVar51._8_4_ = auVar106._8_4_ * fVar287;
      fVar291 = auVar351._12_4_;
      auVar51._12_4_ = auVar106._12_4_ * fVar291;
      fVar294 = auVar351._16_4_;
      auVar51._16_4_ = auVar106._16_4_ * fVar294;
      fVar297 = auVar351._20_4_;
      auVar51._20_4_ = auVar106._20_4_ * fVar297;
      fVar300 = auVar351._24_4_;
      auVar51._24_4_ = auVar106._24_4_ * fVar300;
      auVar51._28_4_ = local_b00._28_4_ + auVar195._12_4_;
      auVar307._8_4_ = 0x3f800000;
      auVar307._0_8_ = 0x3f8000003f800000;
      auVar307._12_4_ = 0x3f800000;
      auVar307._16_4_ = 0x3f800000;
      auVar307._20_4_ = 0x3f800000;
      auVar307._24_4_ = 0x3f800000;
      auVar307._28_4_ = 0x3f800000;
      auVar376 = vsubps_avx(auVar307,auVar51);
      auVar275._8_4_ = 0x7fffffff;
      auVar275._0_8_ = 0x7fffffff7fffffff;
      auVar275._12_4_ = 0x7fffffff;
      auVar275._16_4_ = 0x7fffffff;
      auVar275._20_4_ = 0x7fffffff;
      auVar275._24_4_ = 0x7fffffff;
      auVar275._28_4_ = 0x7fffffff;
      auVar101 = vandps_avx(auVar106,auVar275);
      auVar375._8_4_ = 0x219392ef;
      auVar375._0_8_ = 0x219392ef219392ef;
      auVar375._12_4_ = 0x219392ef;
      auVar375._16_4_ = 0x219392ef;
      auVar375._20_4_ = 0x219392ef;
      auVar375._24_4_ = 0x219392ef;
      auVar375._28_4_ = 0x219392ef;
      auVar102 = vcmpps_avx(auVar101,auVar375,1);
      auVar52._4_4_ =
           (fVar283 + fVar283 * auVar376._4_4_) *
           -(fVar280 * fVar364 + fVar353 * fVar264 + fVar335 * fVar377);
      auVar52._0_4_ =
           (fVar389 + fVar389 * auVar376._0_4_) *
           -(fVar338 * fVar359 + fVar343 * fVar336 + fVar328 * fVar371);
      auVar52._8_4_ =
           (fVar287 + fVar287 * auVar376._8_4_) *
           -(fVar234 * fVar365 + fVar354 * fVar233 + fVar337 * fVar379);
      auVar52._12_4_ =
           (fVar291 + fVar291 * auVar376._12_4_) *
           -(fVar239 * fVar366 + fVar355 * fVar182 + fVar339 * fVar381);
      auVar52._16_4_ =
           (fVar294 + fVar294 * auVar376._16_4_) *
           -(fVar263 * fVar367 + fVar356 * fVar262 + fVar340 * fVar383);
      auVar52._20_4_ =
           (fVar297 + fVar297 * auVar376._20_4_) *
           -(fVar295 * fVar368 + fVar357 * fVar292 + fVar341 * fVar385);
      auVar52._24_4_ =
           (fVar300 + fVar300 * auVar376._24_4_) *
           -(fVar322 * fVar369 + fVar358 * fVar321 + fVar342 * fVar387);
      auVar52._28_4_ = auVar351._28_4_ + auVar376._28_4_;
      auVar351 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar101 = vcmpps_avx(auVar106,auVar351,1);
      auVar101 = vorps_avx(auVar102,auVar101);
      auVar325._8_4_ = 0xff800000;
      auVar325._0_8_ = 0xff800000ff800000;
      auVar325._12_4_ = 0xff800000;
      auVar325._16_4_ = 0xff800000;
      auVar325._20_4_ = 0xff800000;
      auVar325._24_4_ = 0xff800000;
      auVar325._28_4_ = 0xff800000;
      auVar101 = vblendvps_avx(auVar52,auVar325,auVar101);
      auVar351 = vcmpps_avx(auVar106,auVar351,6);
      auVar102 = vorps_avx(auVar102,auVar351);
      auVar332._8_4_ = 0x7f800000;
      auVar332._0_8_ = 0x7f8000007f800000;
      auVar332._12_4_ = 0x7f800000;
      auVar332._16_4_ = 0x7f800000;
      auVar332._20_4_ = 0x7f800000;
      auVar332._24_4_ = 0x7f800000;
      auVar332._28_4_ = 0x7f800000;
      auVar102 = vblendvps_avx(auVar52,auVar332,auVar102);
      auVar351 = vmaxps_avx(local_3e0,auVar392);
      auVar351 = vmaxps_avx(auVar351,auVar101);
      auVar29 = vminps_avx(auVar29,auVar102);
      auVar376 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar101 = vsubps_avx(auVar376,auVar103);
      auVar102 = vsubps_avx(auVar376,auVar139);
      auVar53._4_4_ = auVar102._4_4_ * -fVar117;
      auVar53._0_4_ = auVar102._0_4_ * -fVar88;
      auVar53._8_4_ = auVar102._8_4_ * -fVar119;
      auVar53._12_4_ = auVar102._12_4_ * -fVar121;
      auVar53._16_4_ = auVar102._16_4_ * -fVar122;
      auVar53._20_4_ = auVar102._20_4_ * -fVar123;
      auVar53._24_4_ = auVar102._24_4_ * -fVar124;
      auVar53._28_4_ = auVar102._28_4_;
      auVar54._4_4_ = fVar209 * auVar101._4_4_;
      auVar54._0_4_ = fVar334 * auVar101._0_4_;
      auVar54._8_4_ = fVar211 * auVar101._8_4_;
      auVar54._12_4_ = fVar238 * auVar101._12_4_;
      auVar54._16_4_ = fVar261 * auVar101._16_4_;
      auVar54._20_4_ = fVar289 * auVar101._20_4_;
      auVar54._24_4_ = fVar20 * auVar101._24_4_;
      auVar54._28_4_ = auVar101._28_4_;
      auVar101 = vsubps_avx(auVar53,auVar54);
      auVar102 = vsubps_avx(auVar376,auVar27);
      auVar55._4_4_ = fVar378 * auVar102._4_4_;
      auVar55._0_4_ = fVar372 * auVar102._0_4_;
      auVar55._8_4_ = fVar380 * auVar102._8_4_;
      auVar55._12_4_ = fVar382 * auVar102._12_4_;
      auVar55._16_4_ = fVar384 * auVar102._16_4_;
      auVar55._20_4_ = fVar386 * auVar102._20_4_;
      uVar84 = auVar102._28_4_;
      auVar55._24_4_ = fVar388 * auVar102._24_4_;
      auVar55._28_4_ = uVar84;
      auVar103 = vsubps_avx(auVar101,auVar55);
      auVar56._4_4_ = (float)local_900._4_4_ * -fVar117;
      auVar56._0_4_ = (float)local_900._0_4_ * -fVar88;
      auVar56._8_4_ = fStack_8f8 * -fVar119;
      auVar56._12_4_ = fStack_8f4 * -fVar121;
      auVar56._16_4_ = fStack_8f0 * -fVar122;
      auVar56._20_4_ = fStack_8ec * -fVar123;
      auVar56._24_4_ = fStack_8e8 * -fVar124;
      auVar56._28_4_ = local_980._28_4_ ^ 0x80000000;
      auVar57._4_4_ = (float)local_7e0._4_4_ * fVar209;
      auVar57._0_4_ = (float)local_7e0._0_4_ * fVar334;
      auVar57._8_4_ = fStack_7d8 * fVar211;
      auVar57._12_4_ = fStack_7d4 * fVar238;
      auVar57._16_4_ = fStack_7d0 * fVar261;
      auVar57._20_4_ = fStack_7cc * fVar289;
      auVar57._24_4_ = fStack_7c8 * fVar20;
      auVar57._28_4_ = uVar84;
      auVar348._8_4_ = 0x3f800000;
      auVar348._0_8_ = 0x3f8000003f800000;
      auVar348._12_4_ = 0x3f800000;
      auVar348._16_4_ = 0x3f800000;
      auVar348._20_4_ = 0x3f800000;
      auVar348._24_4_ = 0x3f800000;
      auVar348._28_4_ = 0x3f800000;
      auVar101 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = fVar378 * (float)local_a80._4_4_;
      auVar58._0_4_ = fVar372 * (float)local_a80._0_4_;
      auVar58._8_4_ = fVar380 * fStack_a78;
      auVar58._12_4_ = fVar382 * fStack_a74;
      auVar58._16_4_ = fVar384 * fStack_a70;
      auVar58._20_4_ = fVar386 * fStack_a6c;
      auVar58._24_4_ = fVar388 * fStack_a68;
      auVar58._28_4_ = uVar84;
      auVar139 = vsubps_avx(auVar101,auVar58);
      auVar101 = vrcpps_avx(auVar139);
      fVar334 = auVar101._0_4_;
      fVar336 = auVar101._4_4_;
      auVar59._4_4_ = auVar139._4_4_ * fVar336;
      auVar59._0_4_ = auVar139._0_4_ * fVar334;
      fVar338 = auVar101._8_4_;
      auVar59._8_4_ = auVar139._8_4_ * fVar338;
      fVar209 = auVar101._12_4_;
      auVar59._12_4_ = auVar139._12_4_ * fVar209;
      fVar264 = auVar101._16_4_;
      auVar59._16_4_ = auVar139._16_4_ * fVar264;
      fVar280 = auVar101._20_4_;
      auVar59._20_4_ = auVar139._20_4_ * fVar280;
      fVar211 = auVar101._24_4_;
      auVar59._24_4_ = auVar139._24_4_ * fVar211;
      auVar59._28_4_ = fStack_8e4;
      auVar376 = vsubps_avx(auVar348,auVar59);
      auVar101 = vandps_avx(auVar139,auVar275);
      auVar276._8_4_ = 0x219392ef;
      auVar276._0_8_ = 0x219392ef219392ef;
      auVar276._12_4_ = 0x219392ef;
      auVar276._16_4_ = 0x219392ef;
      auVar276._20_4_ = 0x219392ef;
      auVar276._24_4_ = 0x219392ef;
      auVar276._28_4_ = 0x219392ef;
      auVar102 = vcmpps_avx(auVar101,auVar276,1);
      auVar60._4_4_ = (fVar336 + fVar336 * auVar376._4_4_) * -auVar103._4_4_;
      auVar60._0_4_ = (fVar334 + fVar334 * auVar376._0_4_) * -auVar103._0_4_;
      auVar60._8_4_ = (fVar338 + fVar338 * auVar376._8_4_) * -auVar103._8_4_;
      auVar60._12_4_ = (fVar209 + fVar209 * auVar376._12_4_) * -auVar103._12_4_;
      auVar60._16_4_ = (fVar264 + fVar264 * auVar376._16_4_) * -auVar103._16_4_;
      auVar60._20_4_ = (fVar280 + fVar280 * auVar376._20_4_) * -auVar103._20_4_;
      auVar60._24_4_ = (fVar211 + fVar211 * auVar376._24_4_) * -auVar103._24_4_;
      auVar60._28_4_ = auVar103._28_4_ ^ 0x80000000;
      auVar101 = vcmpps_avx(auVar139,ZEXT832(0) << 0x20,1);
      auVar101 = vorps_avx(auVar102,auVar101);
      auVar101 = vblendvps_avx(auVar60,auVar325,auVar101);
      local_800 = vmaxps_avx(auVar351,auVar101);
      auVar101 = vcmpps_avx(auVar139,ZEXT832(0) << 0x20,6);
      auVar101 = vorps_avx(auVar102,auVar101);
      auVar102 = vblendvps_avx(auVar60,auVar332,auVar101);
      auVar101 = vandps_avx(auVar232._0_32_,local_520);
      local_460 = vminps_avx(auVar29,auVar102);
      auVar102 = vcmpps_avx(local_800,local_460,2);
      auVar351 = auVar101 & auVar102;
      if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar351 >> 0x7f,0) != '\0') ||
            (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar351 >> 0xbf,0) != '\0') ||
          (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar351[0x1f] < '\0') {
        auVar351 = vminps_avx(auVar274,auVar164);
        auVar103 = vminps_avx(auVar26,auVar28);
        auVar351 = vminps_avx(auVar351,auVar103);
        auVar351 = vsubps_avx(auVar351,auVar225);
        auVar101 = vandps_avx(auVar102,auVar101);
        auVar74._4_4_ = fStack_41c;
        auVar74._0_4_ = local_420;
        auVar74._8_4_ = fStack_418;
        auVar74._12_4_ = fStack_414;
        auVar74._16_4_ = fStack_410;
        auVar74._20_4_ = fStack_40c;
        auVar74._24_4_ = fStack_408;
        auVar74._28_4_ = fStack_404;
        auVar102 = vminps_avx(auVar74,auVar348);
        auVar223 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar102 = vmaxps_avx(auVar102,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar87 + fVar125 * (auVar102._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar116 + fVar150 * (auVar102._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar118 + fVar151 * (auVar102._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar120 + fVar152 * (auVar102._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar87 + fVar125 * (auVar102._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar116 + fVar150 * (auVar102._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar118 + fVar151 * (auVar102._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar120 + auVar102._28_4_ + 7.0;
        auVar75._4_4_ = fStack_3fc;
        auVar75._0_4_ = local_400;
        auVar75._8_4_ = fStack_3f8;
        auVar75._12_4_ = fStack_3f4;
        auVar75._16_4_ = fStack_3f0;
        auVar75._20_4_ = fStack_3ec;
        auVar75._24_4_ = fStack_3e8;
        auVar75._28_4_ = fStack_3e4;
        auVar102 = vminps_avx(auVar75,auVar348);
        auVar102 = vmaxps_avx(auVar102,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar87 + fVar125 * (auVar102._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar116 + fVar150 * (auVar102._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar118 + fVar151 * (auVar102._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar120 + fVar152 * (auVar102._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar87 + fVar125 * (auVar102._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar116 + fVar150 * (auVar102._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar118 + fVar151 * (auVar102._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar120 + auVar102._28_4_ + 7.0;
        auVar61._4_4_ = auVar351._4_4_ * 0.99999976;
        auVar61._0_4_ = auVar351._0_4_ * 0.99999976;
        auVar61._8_4_ = auVar351._8_4_ * 0.99999976;
        auVar61._12_4_ = auVar351._12_4_ * 0.99999976;
        auVar61._16_4_ = auVar351._16_4_ * 0.99999976;
        auVar61._20_4_ = auVar351._20_4_ * 0.99999976;
        auVar61._24_4_ = auVar351._24_4_ * 0.99999976;
        auVar61._28_4_ = 0x3f7ffffc;
        auVar102 = vmaxps_avx(ZEXT832(0) << 0x20,auVar61);
        auVar62._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar62._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar62._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar62._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar62._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar62._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar62._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar62._28_4_ = auVar102._28_4_;
        local_ac0 = vsubps_avx(auVar30,auVar62);
        auVar63._4_4_ = local_ac0._4_4_ * fVar370 * 4.0;
        auVar63._0_4_ = local_ac0._0_4_ * fVar318 * 4.0;
        auVar63._8_4_ = local_ac0._8_4_ * fVar174 * 4.0;
        auVar63._12_4_ = local_ac0._12_4_ * fVar176 * 4.0;
        auVar63._16_4_ = local_ac0._16_4_ * fVar178 * 4.0;
        auVar63._20_4_ = local_ac0._20_4_ * fVar180 * 4.0;
        auVar63._24_4_ = local_ac0._24_4_ * fVar183 * 4.0;
        auVar63._28_4_ = auVar102._28_4_;
        auVar351 = vsubps_avx(auVar45,auVar63);
        auVar102 = vcmpps_avx(auVar351,ZEXT832(0) << 0x20,5);
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar102 >> 0x7f,0) == '\0') &&
              (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar102 >> 0xbf,0) == '\0') &&
            (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar102[0x1f]) {
          auVar273 = ZEXT828(0) << 0x20;
          auVar247 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar394 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_b40 = ZEXT832(0) << 0x20;
          auVar308._8_4_ = 0x7f800000;
          auVar308._0_8_ = 0x7f8000007f800000;
          auVar308._12_4_ = 0x7f800000;
          auVar308._16_4_ = 0x7f800000;
          auVar308._20_4_ = 0x7f800000;
          auVar308._24_4_ = 0x7f800000;
          auVar308._28_4_ = 0x7f800000;
          auVar349._8_4_ = 0xff800000;
          auVar349._0_8_ = 0xff800000ff800000;
          auVar349._12_4_ = 0xff800000;
          auVar349._16_4_ = 0xff800000;
          auVar349._20_4_ = 0xff800000;
          auVar349._24_4_ = 0xff800000;
          auVar349._28_4_ = 0xff800000;
          _local_b20 = _local_b40;
          local_ac0 = auVar27;
        }
        else {
          auVar103 = vrcpps_avx(local_340);
          fVar318 = auVar103._0_4_;
          auVar227._0_4_ = local_340._0_4_ * fVar318;
          fVar334 = auVar103._4_4_;
          auVar227._4_4_ = local_340._4_4_ * fVar334;
          fVar336 = auVar103._8_4_;
          auVar227._8_4_ = local_340._8_4_ * fVar336;
          fVar338 = auVar103._12_4_;
          auVar227._12_4_ = local_340._12_4_ * fVar338;
          fVar209 = auVar103._16_4_;
          auVar227._16_4_ = local_340._16_4_ * fVar209;
          fVar264 = auVar103._20_4_;
          auVar227._20_4_ = local_340._20_4_ * fVar264;
          fVar280 = auVar103._24_4_;
          auVar227._24_4_ = local_340._24_4_ * fVar280;
          auVar227._28_4_ = 0;
          auVar26 = vsubps_avx(auVar348,auVar227);
          auVar139 = vsqrtps_avx(auVar351);
          fVar318 = fVar318 + fVar318 * auVar26._0_4_;
          fVar334 = fVar334 + fVar334 * auVar26._4_4_;
          fVar336 = fVar336 + fVar336 * auVar26._8_4_;
          fVar338 = fVar338 + fVar338 * auVar26._12_4_;
          fVar209 = fVar209 + fVar209 * auVar26._16_4_;
          fVar264 = fVar264 + fVar264 * auVar26._20_4_;
          fVar280 = fVar280 + fVar280 * auVar26._24_4_;
          auVar27 = vsubps_avx(local_320,auVar139);
          auVar279._0_4_ = auVar27._0_4_ * fVar318;
          auVar279._4_4_ = auVar27._4_4_ * fVar334;
          auVar279._8_4_ = auVar27._8_4_ * fVar336;
          auVar279._12_4_ = auVar27._12_4_ * fVar338;
          auVar279._16_4_ = auVar27._16_4_ * fVar209;
          auVar279._20_4_ = auVar27._20_4_ * fVar264;
          auVar279._28_36_ = auVar232._28_36_;
          auVar279._24_4_ = auVar27._24_4_ * fVar280;
          auVar27 = vsubps_avx(auVar139,local_a00);
          fVar318 = auVar27._0_4_ * fVar318;
          fVar334 = auVar27._4_4_ * fVar334;
          auVar64._4_4_ = fVar334;
          auVar64._0_4_ = fVar318;
          fVar336 = auVar27._8_4_ * fVar336;
          auVar64._8_4_ = fVar336;
          fVar338 = auVar27._12_4_ * fVar338;
          auVar64._12_4_ = fVar338;
          fVar209 = auVar27._16_4_ * fVar209;
          auVar64._16_4_ = fVar209;
          fVar264 = auVar27._20_4_ * fVar264;
          auVar64._20_4_ = fVar264;
          fVar280 = auVar27._24_4_ * fVar280;
          auVar64._24_4_ = fVar280;
          auVar64._28_4_ = fVar152;
          fVar211 = (auVar279._0_4_ * local_560 + local_600) * local_5e0;
          fVar233 = (auVar279._4_4_ * fStack_55c + fStack_5fc) * fStack_5dc;
          fVar234 = (auVar279._8_4_ * fStack_558 + fStack_5f8) * fStack_5d8;
          fVar238 = (auVar279._12_4_ * fStack_554 + fStack_5f4) * fStack_5d4;
          fVar182 = (auVar279._16_4_ * fStack_550 + fStack_5f0) * fStack_5d0;
          fVar239 = (auVar279._20_4_ * fStack_54c + fStack_5ec) * fStack_5cc;
          fVar261 = (auVar279._24_4_ * fStack_548 + fStack_5e8) * fStack_5c8;
          auVar166._0_4_ = fVar266 + fVar211 * fVar327;
          auVar166._4_4_ = fVar282 + fVar233 * fVar208;
          auVar166._8_4_ = fVar286 + fVar234 * fVar210;
          auVar166._12_4_ = fVar290 + fVar238 * fVar237;
          auVar166._16_4_ = fVar293 + fVar182 * fVar260;
          auVar166._20_4_ = fVar296 + fVar239 * fVar285;
          auVar166._24_4_ = fVar299 + fVar261 * fVar19;
          auVar166._28_4_ = fVar301 + auVar103._28_4_ + auVar26._28_4_ + fStack_5e4;
          auVar65._4_4_ = auVar279._4_4_ * (float)local_a80._4_4_;
          auVar65._0_4_ = auVar279._0_4_ * (float)local_a80._0_4_;
          auVar65._8_4_ = auVar279._8_4_ * fStack_a78;
          auVar65._12_4_ = auVar279._12_4_ * fStack_a74;
          auVar65._16_4_ = auVar279._16_4_ * fStack_a70;
          auVar65._20_4_ = auVar279._20_4_ * fStack_a6c;
          auVar65._24_4_ = auVar279._24_4_ * fStack_a68;
          auVar65._28_4_ = auVar139._28_4_;
          local_9a0 = vsubps_avx(auVar65,auVar166);
          auVar253._0_4_ = auVar391._0_4_ + fVar211 * fVar319;
          auVar253._4_4_ = auVar391._4_4_ + fVar233 * fVar149;
          auVar253._8_4_ = auVar391._8_4_ + fVar234 * fVar284;
          auVar253._12_4_ = auVar391._12_4_ + fVar238 * fVar235;
          auVar253._16_4_ = auVar391._16_4_ + fVar182 * fVar258;
          auVar253._20_4_ = auVar391._20_4_ + fVar239 * fVar265;
          auVar253._24_4_ = auVar391._24_4_ + fVar261 * fVar298;
          auVar253._28_4_ = auVar391._28_4_ + auVar139._28_4_;
          auVar66._4_4_ = (float)local_7e0._4_4_ * auVar279._4_4_;
          auVar66._0_4_ = (float)local_7e0._0_4_ * auVar279._0_4_;
          auVar66._8_4_ = fStack_7d8 * auVar279._8_4_;
          auVar66._12_4_ = fStack_7d4 * auVar279._12_4_;
          auVar66._16_4_ = fStack_7d0 * auVar279._16_4_;
          auVar66._20_4_ = fStack_7cc * auVar279._20_4_;
          auVar66._24_4_ = fStack_7c8 * auVar279._24_4_;
          auVar66._28_4_ = 0x3e000000;
          _local_b20 = vsubps_avx(auVar66,auVar253);
          auVar228._0_4_ = local_2e0._0_4_ + fVar320 * fVar211;
          auVar228._4_4_ = local_2e0._4_4_ + fVar185 * fVar233;
          auVar228._8_4_ = local_2e0._8_4_ + fVar288 * fVar234;
          auVar228._12_4_ = local_2e0._12_4_ + fVar236 * fVar238;
          auVar228._16_4_ = local_2e0._16_4_ + fVar259 * fVar182;
          auVar228._20_4_ = local_2e0._20_4_ + fVar281 * fVar239;
          auVar228._24_4_ = local_2e0._24_4_ + fVar18 * fVar261;
          auVar228._28_4_ = local_2e0._28_4_ + auVar27._28_4_;
          auVar67._4_4_ = auVar279._4_4_ * (float)local_900._4_4_;
          auVar67._0_4_ = auVar279._0_4_ * (float)local_900._0_4_;
          auVar67._8_4_ = auVar279._8_4_ * fStack_8f8;
          auVar67._12_4_ = auVar279._12_4_ * fStack_8f4;
          auVar67._16_4_ = auVar279._16_4_ * fStack_8f0;
          auVar67._20_4_ = auVar279._20_4_ * fStack_8ec;
          auVar67._24_4_ = auVar279._24_4_ * fStack_8e8;
          auVar67._28_4_ = auVar253._28_4_;
          _local_b40 = vsubps_avx(auVar67,auVar228);
          fVar211 = (fVar318 * local_560 + local_600) * local_5e0;
          fVar233 = (fVar334 * fStack_55c + fStack_5fc) * fStack_5dc;
          fVar234 = (fVar336 * fStack_558 + fStack_5f8) * fStack_5d8;
          fVar238 = (fVar338 * fStack_554 + fStack_5f4) * fStack_5d4;
          fVar182 = (fVar209 * fStack_550 + fStack_5f0) * fStack_5d0;
          fVar239 = (fVar264 * fStack_54c + fStack_5ec) * fStack_5cc;
          fVar261 = (fVar280 * fStack_548 + fStack_5e8) * fStack_5c8;
          auVar229._0_4_ = fVar266 + fVar211 * fVar327;
          auVar229._4_4_ = fVar282 + fVar233 * fVar208;
          auVar229._8_4_ = fVar286 + fVar234 * fVar210;
          auVar229._12_4_ = fVar290 + fVar238 * fVar237;
          auVar229._16_4_ = fVar293 + fVar182 * fVar260;
          auVar229._20_4_ = fVar296 + fVar239 * fVar285;
          auVar229._24_4_ = fVar299 + fVar261 * fVar19;
          auVar229._28_4_ = fVar301 + local_b40._28_4_ + fStack_5e4;
          auVar68._4_4_ = fVar334 * (float)local_a80._4_4_;
          auVar68._0_4_ = fVar318 * (float)local_a80._0_4_;
          auVar68._8_4_ = fVar336 * fStack_a78;
          auVar68._12_4_ = fVar338 * fStack_a74;
          auVar68._16_4_ = fVar209 * fStack_a70;
          auVar68._20_4_ = fVar264 * fStack_a6c;
          auVar68._24_4_ = fVar280 * fStack_a68;
          auVar68._28_4_ = 0x3e000000;
          auVar103 = vsubps_avx(auVar68,auVar229);
          auVar223 = auVar103._0_28_;
          auVar277._0_4_ = auVar391._0_4_ + fVar211 * fVar319;
          auVar277._4_4_ = auVar391._4_4_ + fVar233 * fVar149;
          auVar277._8_4_ = auVar391._8_4_ + fVar234 * fVar284;
          auVar277._12_4_ = auVar391._12_4_ + fVar238 * fVar235;
          auVar277._16_4_ = auVar391._16_4_ + fVar182 * fVar258;
          auVar277._20_4_ = auVar391._20_4_ + fVar239 * fVar265;
          auVar277._24_4_ = auVar391._24_4_ + fVar261 * fVar298;
          auVar277._28_4_ = auVar391._28_4_ + 0.125;
          auVar69._4_4_ = (float)local_7e0._4_4_ * fVar334;
          auVar69._0_4_ = (float)local_7e0._0_4_ * fVar318;
          auVar69._8_4_ = fStack_7d8 * fVar336;
          auVar69._12_4_ = fStack_7d4 * fVar338;
          auVar69._16_4_ = fStack_7d0 * fVar209;
          auVar69._20_4_ = fStack_7cc * fVar264;
          auVar69._24_4_ = fStack_7c8 * fVar280;
          auVar69._28_4_ = fStack_a64;
          auVar103 = vsubps_avx(auVar69,auVar277);
          auVar273 = auVar103._0_28_;
          auVar254._0_4_ = local_2e0._0_4_ + fVar320 * fVar211;
          auVar254._4_4_ = local_2e0._4_4_ + fVar185 * fVar233;
          auVar254._8_4_ = local_2e0._8_4_ + fVar288 * fVar234;
          auVar254._12_4_ = local_2e0._12_4_ + fVar236 * fVar238;
          auVar254._16_4_ = local_2e0._16_4_ + fVar259 * fVar182;
          auVar254._20_4_ = local_2e0._20_4_ + fVar281 * fVar239;
          auVar254._24_4_ = local_2e0._24_4_ + fVar18 * fVar261;
          auVar254._28_4_ = local_2e0._28_4_ + auVar253._28_4_;
          auVar70._4_4_ = fVar334 * (float)local_900._4_4_;
          auVar70._0_4_ = fVar318 * (float)local_900._0_4_;
          auVar70._8_4_ = fVar336 * fStack_8f8;
          auVar70._12_4_ = fVar338 * fStack_8f4;
          auVar70._16_4_ = fVar209 * fStack_8f0;
          auVar70._20_4_ = fVar264 * fStack_8ec;
          auVar70._24_4_ = fVar280 * fStack_8e8;
          auVar70._28_4_ = fStack_a64;
          auVar103 = vsubps_avx(auVar70,auVar254);
          auVar247 = auVar103._0_28_;
          auVar351 = vcmpps_avx(auVar351,ZEXT832(0) << 0x20,5);
          auVar309._8_4_ = 0x7f800000;
          auVar309._0_8_ = 0x7f8000007f800000;
          auVar309._12_4_ = 0x7f800000;
          auVar309._16_4_ = 0x7f800000;
          auVar309._20_4_ = 0x7f800000;
          auVar309._24_4_ = 0x7f800000;
          auVar309._28_4_ = 0x7f800000;
          auVar308 = vblendvps_avx(auVar309,auVar279._0_32_,auVar351);
          auVar103 = vmaxps_avx(local_580,local_440);
          auVar71._4_4_ = auVar103._4_4_ * 1.9073486e-06;
          auVar71._0_4_ = auVar103._0_4_ * 1.9073486e-06;
          auVar71._8_4_ = auVar103._8_4_ * 1.9073486e-06;
          auVar71._12_4_ = auVar103._12_4_ * 1.9073486e-06;
          auVar71._16_4_ = auVar103._16_4_ * 1.9073486e-06;
          auVar71._20_4_ = auVar103._20_4_ * 1.9073486e-06;
          auVar71._24_4_ = auVar103._24_4_ * 1.9073486e-06;
          auVar71._28_4_ = auVar103._28_4_;
          auVar103 = vcmpps_avx(local_9e0,auVar71,1);
          auVar350._8_4_ = 0xff800000;
          auVar350._0_8_ = 0xff800000ff800000;
          auVar350._12_4_ = 0xff800000;
          auVar350._16_4_ = 0xff800000;
          auVar350._20_4_ = 0xff800000;
          auVar350._24_4_ = 0xff800000;
          auVar350._28_4_ = 0xff800000;
          auVar349 = vblendvps_avx(auVar350,auVar64,auVar351);
          auVar139 = auVar351 & auVar103;
          if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar139 >> 0x7f,0) != '\0') ||
                (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar139 >> 0xbf,0) != '\0') ||
              (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar139[0x1f] < '\0') {
            auVar102 = vandps_avx(auVar103,auVar351);
            auVar195 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
            auVar139 = vcmpps_avx(local_ac0,_DAT_01f7b000,2);
            auVar148._8_4_ = 0xff800000;
            auVar148._0_8_ = 0xff800000ff800000;
            auVar148._12_4_ = 0xff800000;
            auVar148._16_4_ = 0xff800000;
            auVar148._20_4_ = 0xff800000;
            auVar148._24_4_ = 0xff800000;
            auVar148._28_4_ = 0xff800000;
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar103 = vblendvps_avx(auVar172,auVar148,auVar139);
            auVar270 = vpmovsxwd_avx(auVar195);
            auVar195 = vpunpckhwd_avx(auVar195,auVar195);
            auVar393._16_16_ = auVar195;
            auVar393._0_16_ = auVar270;
            auVar308 = vblendvps_avx(auVar308,auVar103,auVar393);
            auVar103 = vblendvps_avx(auVar148,auVar172,auVar139);
            auVar349 = vblendvps_avx(auVar349,auVar103,auVar393);
            auVar207._0_8_ = auVar102._0_8_ ^ 0xffffffffffffffff;
            auVar207._8_4_ = auVar102._8_4_ ^ 0xffffffff;
            auVar207._12_4_ = auVar102._12_4_ ^ 0xffffffff;
            auVar207._16_4_ = auVar102._16_4_ ^ 0xffffffff;
            auVar207._20_4_ = auVar102._20_4_ ^ 0xffffffff;
            auVar207._24_4_ = auVar102._24_4_ ^ 0xffffffff;
            auVar207._28_4_ = auVar102._28_4_ ^ 0xffffffff;
            auVar102 = vorps_avx(auVar139,auVar207);
            auVar102 = vandps_avx(auVar351,auVar102);
          }
          auVar394 = local_9a0._0_28_;
        }
        _local_4c0 = local_800;
        local_4a0 = vminps_avx(local_460,auVar308);
        _local_880 = vmaxps_avx(local_800,auVar349);
        _local_480 = _local_880;
        auVar351 = vcmpps_avx(local_800,local_4a0,2);
        local_760 = vandps_avx(auVar101,auVar351);
        auVar351 = vcmpps_avx(_local_880,local_460,2);
        local_8e0 = vandps_avx(auVar101,auVar351);
        auVar101 = vorps_avx(local_8e0,local_760);
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar101 >> 0x7f,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar101 >> 0xbf,0) != '\0') ||
            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar101[0x1f] < '\0') {
          auStack_938 = auVar28._8_24_;
          auVar140._0_8_ = auVar102._0_8_ ^ 0xffffffffffffffff;
          auVar140._8_4_ = auVar102._8_4_ ^ 0xffffffff;
          auVar140._12_4_ = auVar102._12_4_ ^ 0xffffffff;
          auVar140._16_4_ = auVar102._16_4_ ^ 0xffffffff;
          auVar140._20_4_ = auVar102._20_4_ ^ 0xffffffff;
          auVar140._24_4_ = auVar102._24_4_ ^ 0xffffffff;
          fVar318 = auVar102._28_4_;
          auVar140._28_4_ = (uint)fVar318 ^ 0xffffffff;
          auVar108._0_4_ =
               (float)local_a80._0_4_ * auVar223._0_4_ +
               (float)local_7e0._0_4_ * auVar273._0_4_ + (float)local_900._0_4_ * auVar247._0_4_;
          auVar108._4_4_ =
               (float)local_a80._4_4_ * auVar223._4_4_ +
               (float)local_7e0._4_4_ * auVar273._4_4_ + (float)local_900._4_4_ * auVar247._4_4_;
          auVar108._8_4_ =
               fStack_a78 * auVar223._8_4_ +
               fStack_7d8 * auVar273._8_4_ + fStack_8f8 * auVar247._8_4_;
          auVar108._12_4_ =
               fStack_a74 * auVar223._12_4_ +
               fStack_7d4 * auVar273._12_4_ + fStack_8f4 * auVar247._12_4_;
          auVar108._16_4_ =
               fStack_a70 * auVar223._16_4_ +
               fStack_7d0 * auVar273._16_4_ + fStack_8f0 * auVar247._16_4_;
          auVar108._20_4_ =
               fStack_a6c * auVar223._20_4_ +
               fStack_7cc * auVar273._20_4_ + fStack_8ec * auVar247._20_4_;
          auVar108._24_4_ =
               fStack_a68 * auVar223._24_4_ +
               fStack_7c8 * auVar273._24_4_ + fStack_8e8 * auVar247._24_4_;
          auVar108._28_4_ = fVar318 + local_8e0._28_4_ + auVar101._28_4_;
          auVar230._8_4_ = 0x7fffffff;
          auVar230._0_8_ = 0x7fffffff7fffffff;
          auVar230._12_4_ = 0x7fffffff;
          auVar230._16_4_ = 0x7fffffff;
          auVar230._20_4_ = 0x7fffffff;
          auVar230._24_4_ = 0x7fffffff;
          auVar230._28_4_ = 0x7fffffff;
          auVar101 = vandps_avx(auVar108,auVar230);
          auVar255._8_4_ = 0x3e99999a;
          auVar255._0_8_ = 0x3e99999a3e99999a;
          auVar255._12_4_ = 0x3e99999a;
          auVar255._16_4_ = 0x3e99999a;
          auVar255._20_4_ = 0x3e99999a;
          auVar255._24_4_ = 0x3e99999a;
          auVar255._28_4_ = 0x3e99999a;
          auVar101 = vcmpps_avx(auVar101,auVar255,1);
          local_7a0 = vorps_avx(auVar101,auVar140);
          auVar109._0_4_ =
               auVar394._0_4_ * (float)local_a80._0_4_ +
               (float)local_7e0._0_4_ * (float)local_b20._0_4_ +
               (float)local_900._0_4_ * (float)local_b40._0_4_;
          auVar109._4_4_ =
               auVar394._4_4_ * (float)local_a80._4_4_ +
               (float)local_7e0._4_4_ * (float)local_b20._4_4_ +
               (float)local_900._4_4_ * (float)local_b40._4_4_;
          auVar109._8_4_ =
               auVar394._8_4_ * fStack_a78 + fStack_7d8 * fStack_b18 + fStack_8f8 * fStack_b38;
          auVar109._12_4_ =
               auVar394._12_4_ * fStack_a74 + fStack_7d4 * fStack_b14 + fStack_8f4 * fStack_b34;
          auVar109._16_4_ =
               auVar394._16_4_ * fStack_a70 + fStack_7d0 * fStack_b10 + fStack_8f0 * fStack_b30;
          auVar109._20_4_ =
               auVar394._20_4_ * fStack_a6c + fStack_7cc * fStack_b0c + fStack_8ec * fStack_b2c;
          auVar109._24_4_ =
               auVar394._24_4_ * fStack_a68 + fStack_7c8 * fStack_b08 + fStack_8e8 * fStack_b28;
          auVar109._28_4_ = local_7a0._28_4_ + local_760._28_4_ + fVar318;
          auVar101 = vandps_avx(auVar109,auVar230);
          auVar101 = vcmpps_avx(auVar101,auVar255,1);
          auVar101 = vorps_avx(auVar101,auVar140);
          auVar141._8_4_ = 3;
          auVar141._0_8_ = 0x300000003;
          auVar141._12_4_ = 3;
          auVar141._16_4_ = 3;
          auVar141._20_4_ = 3;
          auVar141._24_4_ = 3;
          auVar141._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar101 = vblendvps_avx(auVar168,auVar141,auVar101);
          local_7c0 = ZEXT432(local_ce4);
          local_820 = vpshufd_avx(ZEXT416(local_ce4),0);
          auVar195 = vpcmpgtd_avx(auVar101._16_16_,local_820);
          auStack_810 = auVar204._16_16_;
          auVar270 = vpcmpgtd_avx(auVar101._0_16_,local_820);
          auVar142._16_16_ = auVar195;
          auVar142._0_16_ = auVar270;
          local_780 = vblendps_avx(ZEXT1632(auVar270),auVar142,0xf0);
          auVar101 = vandnps_avx(local_780,local_760);
          local_8a0._4_4_ = local_800._4_4_ + (float)local_920._4_4_;
          local_8a0._0_4_ = local_800._0_4_ + (float)local_920._0_4_;
          fStack_898 = local_800._8_4_ + fStack_918;
          fStack_894 = local_800._12_4_ + fStack_914;
          fStack_890 = local_800._16_4_ + fStack_910;
          fStack_88c = local_800._20_4_ + fStack_90c;
          fStack_888 = local_800._24_4_ + fStack_908;
          fStack_884 = local_800._28_4_ + fStack_904;
          while( true ) {
            local_4e0 = auVar101;
            local_c80 = auVar25._0_4_;
            fStack_c7c = auVar25._4_4_;
            fStack_c78 = auVar25._8_4_;
            fStack_c74 = auVar25._12_4_;
            local_ca0 = auVar23._0_4_;
            fStack_c9c = auVar23._4_4_;
            fStack_c98 = auVar23._8_4_;
            fStack_c94 = auVar23._12_4_;
            local_c70 = auVar22._0_4_;
            fStack_c6c = auVar22._4_4_;
            fStack_c68 = auVar22._8_4_;
            fStack_c64 = auVar22._12_4_;
            if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar101 >> 0x7f,0) == '\0') &&
                  (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar101 >> 0xbf,0) == '\0') &&
                (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar101[0x1f]) break;
            auVar143._8_4_ = 0x7f800000;
            auVar143._0_8_ = 0x7f8000007f800000;
            auVar143._12_4_ = 0x7f800000;
            auVar143._16_4_ = 0x7f800000;
            auVar143._20_4_ = 0x7f800000;
            auVar143._24_4_ = 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar102 = vblendvps_avx(auVar143,local_800,auVar101);
            auVar351 = vshufps_avx(auVar102,auVar102,0xb1);
            auVar351 = vminps_avx(auVar102,auVar351);
            auVar103 = vshufpd_avx(auVar351,auVar351,5);
            auVar351 = vminps_avx(auVar351,auVar103);
            auVar103 = vperm2f128_avx(auVar351,auVar351,1);
            auVar351 = vminps_avx(auVar351,auVar103);
            auVar102 = vcmpps_avx(auVar102,auVar351,0);
            auVar351 = auVar101 & auVar102;
            if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar351 >> 0x7f,0) != '\0') ||
                  (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar351 >> 0xbf,0) != '\0') ||
                (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar351[0x1f] < '\0') {
              auVar101 = vandps_avx(auVar102,auVar101);
            }
            uVar76 = vmovmskps_avx(auVar101);
            uVar85 = 0;
            if (uVar76 != 0) {
              for (; (uVar76 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
              }
            }
            uVar79 = (ulong)uVar85;
            *(undefined4 *)(local_4e0 + uVar79 * 4) = 0;
            fVar318 = local_1a0[uVar79];
            uVar85 = *(uint *)(local_4c0 + uVar79 * 4);
            fVar319 = auVar127._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar319 = sqrtf((float)local_a20._0_4_);
            }
            auVar270 = vminps_avx(auVar23,auVar25);
            auVar195 = vmaxps_avx(auVar23,auVar25);
            auVar24 = vminps_avx(auVar22,_local_b80);
            auVar94 = vminps_avx(auVar270,auVar24);
            auVar270 = vmaxps_avx(auVar22,_local_b80);
            auVar24 = vmaxps_avx(auVar195,auVar270);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar195 = vandps_avx(auVar94,auVar190);
            auVar270 = vandps_avx(auVar24,auVar190);
            auVar195 = vmaxps_avx(auVar195,auVar270);
            auVar270 = vmovshdup_avx(auVar195);
            auVar270 = vmaxss_avx(auVar270,auVar195);
            auVar195 = vshufpd_avx(auVar195,auVar195,1);
            auVar195 = vmaxss_avx(auVar195,auVar270);
            local_b20._0_4_ = auVar195._0_4_ * 1.9073486e-06;
            local_ac0._0_4_ = fVar319 * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar24,auVar24,0xff);
            auVar195 = vinsertps_avx(ZEXT416(uVar85),ZEXT416((uint)fVar318),0x10);
            auVar232 = ZEXT1664(auVar195);
            lVar83 = 5;
            do {
              do {
                bVar86 = lVar83 == 0;
                lVar83 = lVar83 + -1;
                if (bVar86) goto LAB_008feff3;
                auVar270 = auVar232._0_16_;
                auVar195 = vmovshdup_avx(auVar270);
                fVar284 = auVar195._0_4_;
                fVar334 = 1.0 - fVar284;
                auVar195 = vshufps_avx(auVar270,auVar270,0x55);
                fVar318 = auVar195._0_4_;
                fVar319 = auVar195._4_4_;
                fVar320 = auVar195._8_4_;
                fVar327 = auVar195._12_4_;
                auVar195 = vshufps_avx(ZEXT416((uint)fVar334),ZEXT416((uint)fVar334),0);
                fVar336 = auVar195._0_4_;
                fVar338 = auVar195._4_4_;
                fVar149 = auVar195._8_4_;
                fVar185 = auVar195._12_4_;
                fVar208 = local_c70 * fVar318 + local_c80 * fVar336;
                fVar209 = fStack_c6c * fVar319 + fStack_c7c * fVar338;
                fVar264 = fStack_c68 * fVar320 + fStack_c78 * fVar149;
                fVar280 = fStack_c64 * fVar327 + fStack_c74 * fVar185;
                auVar242._0_4_ =
                     fVar336 * (local_c80 * fVar318 + fVar336 * local_ca0) + fVar318 * fVar208;
                auVar242._4_4_ =
                     fVar338 * (fStack_c7c * fVar319 + fVar338 * fStack_c9c) + fVar319 * fVar209;
                auVar242._8_4_ =
                     fVar149 * (fStack_c78 * fVar320 + fVar149 * fStack_c98) + fVar320 * fVar264;
                auVar242._12_4_ =
                     fVar185 * (fStack_c74 * fVar327 + fVar185 * fStack_c94) + fVar327 * fVar280;
                auVar191._0_4_ =
                     fVar336 * fVar208 +
                     fVar318 * (fVar318 * (float)local_b80._0_4_ + local_c70 * fVar336);
                auVar191._4_4_ =
                     fVar338 * fVar209 +
                     fVar319 * (fVar319 * (float)local_b80._4_4_ + fStack_c6c * fVar338);
                auVar191._8_4_ =
                     fVar149 * fVar264 + fVar320 * (fVar320 * fStack_b78 + fStack_c68 * fVar149);
                auVar191._12_4_ =
                     fVar185 * fVar280 + fVar327 * (fVar327 * fStack_b74 + fStack_c64 * fVar185);
                auVar195 = vshufps_avx(auVar270,auVar270,0);
                auVar129._0_4_ = auVar195._0_4_ * (float)local_a10._0_4_ + 0.0;
                auVar129._4_4_ = auVar195._4_4_ * (float)local_a10._4_4_ + 0.0;
                auVar129._8_4_ = auVar195._8_4_ * fStack_a08 + 0.0;
                auVar129._12_4_ = auVar195._12_4_ * fStack_a04 + 0.0;
                auVar93._0_4_ = fVar336 * auVar242._0_4_ + fVar318 * auVar191._0_4_;
                auVar93._4_4_ = fVar338 * auVar242._4_4_ + fVar319 * auVar191._4_4_;
                auVar93._8_4_ = fVar149 * auVar242._8_4_ + fVar320 * auVar191._8_4_;
                auVar93._12_4_ = fVar185 * auVar242._12_4_ + fVar327 * auVar191._12_4_;
                local_9a0._0_16_ = auVar93;
                auVar195 = vsubps_avx(auVar129,auVar93);
                _local_b40 = auVar195;
                auVar195 = vdpps_avx(auVar195,auVar195,0x7f);
                fVar318 = auVar195._0_4_;
                if (fVar318 < 0.0) {
                  local_ae0._0_16_ = auVar191;
                  fVar319 = sqrtf(fVar318);
                  auVar232 = ZEXT1664(auVar270);
                  auVar191 = local_ae0._0_16_;
                }
                else {
                  auVar24 = vsqrtss_avx(auVar195,auVar195);
                  fVar319 = auVar24._0_4_;
                }
                auVar24 = vsubps_avx(auVar191,auVar242);
                auVar304._0_4_ = auVar24._0_4_ * 3.0;
                auVar304._4_4_ = auVar24._4_4_ * 3.0;
                auVar304._8_4_ = auVar24._8_4_ * 3.0;
                auVar304._12_4_ = auVar24._12_4_ * 3.0;
                auVar24 = vshufps_avx(ZEXT416((uint)(fVar284 * 6.0)),ZEXT416((uint)(fVar284 * 6.0)),
                                      0);
                auVar94 = ZEXT416((uint)((fVar334 - (fVar284 + fVar284)) * 6.0));
                auVar159 = vshufps_avx(auVar94,auVar94,0);
                auVar94 = ZEXT416((uint)((fVar284 - (fVar334 + fVar334)) * 6.0));
                auVar192 = vshufps_avx(auVar94,auVar94,0);
                auVar89 = vshufps_avx(ZEXT416((uint)(fVar334 * 6.0)),ZEXT416((uint)(fVar334 * 6.0)),
                                      0);
                auVar94 = vdpps_avx(auVar304,auVar304,0x7f);
                auVar130._0_4_ =
                     auVar89._0_4_ * local_ca0 +
                     auVar192._0_4_ * local_c80 +
                     auVar24._0_4_ * (float)local_b80._0_4_ + auVar159._0_4_ * local_c70;
                auVar130._4_4_ =
                     auVar89._4_4_ * fStack_c9c +
                     auVar192._4_4_ * fStack_c7c +
                     auVar24._4_4_ * (float)local_b80._4_4_ + auVar159._4_4_ * fStack_c6c;
                auVar130._8_4_ =
                     auVar89._8_4_ * fStack_c98 +
                     auVar192._8_4_ * fStack_c78 +
                     auVar24._8_4_ * fStack_b78 + auVar159._8_4_ * fStack_c68;
                auVar130._12_4_ =
                     auVar89._12_4_ * fStack_c94 +
                     auVar192._12_4_ * fStack_c74 +
                     auVar24._12_4_ * fStack_b74 + auVar159._12_4_ * fStack_c64;
                auVar24 = vblendps_avx(auVar94,_DAT_01f45a50,0xe);
                auVar159 = vrsqrtss_avx(auVar24,auVar24);
                fVar327 = auVar159._0_4_;
                fVar320 = auVar94._0_4_;
                auVar159 = vdpps_avx(auVar304,auVar130,0x7f);
                auVar192 = vshufps_avx(auVar94,auVar94,0);
                auVar131._0_4_ = auVar130._0_4_ * auVar192._0_4_;
                auVar131._4_4_ = auVar130._4_4_ * auVar192._4_4_;
                auVar131._8_4_ = auVar130._8_4_ * auVar192._8_4_;
                auVar131._12_4_ = auVar130._12_4_ * auVar192._12_4_;
                auVar159 = vshufps_avx(auVar159,auVar159,0);
                auVar215._0_4_ = auVar304._0_4_ * auVar159._0_4_;
                auVar215._4_4_ = auVar304._4_4_ * auVar159._4_4_;
                auVar215._8_4_ = auVar304._8_4_ * auVar159._8_4_;
                auVar215._12_4_ = auVar304._12_4_ * auVar159._12_4_;
                auVar89 = vsubps_avx(auVar131,auVar215);
                auVar159 = vrcpss_avx(auVar24,auVar24);
                auVar24 = vmaxss_avx(ZEXT416((uint)local_b20._0_4_),
                                     ZEXT416((uint)(auVar232._0_4_ * (float)local_ac0._0_4_)));
                auVar159 = ZEXT416((uint)(auVar159._0_4_ * (2.0 - fVar320 * auVar159._0_4_)));
                auVar159 = vshufps_avx(auVar159,auVar159,0);
                uVar79 = CONCAT44(auVar304._4_4_,auVar304._0_4_);
                auVar243._0_8_ = uVar79 ^ 0x8000000080000000;
                auVar243._8_4_ = -auVar304._8_4_;
                auVar243._12_4_ = -auVar304._12_4_;
                auVar192 = ZEXT416((uint)(fVar327 * 1.5 +
                                         fVar320 * -0.5 * fVar327 * fVar327 * fVar327));
                auVar192 = vshufps_avx(auVar192,auVar192,0);
                auVar193._0_4_ = auVar192._0_4_ * auVar89._0_4_ * auVar159._0_4_;
                auVar193._4_4_ = auVar192._4_4_ * auVar89._4_4_ * auVar159._4_4_;
                auVar193._8_4_ = auVar192._8_4_ * auVar89._8_4_ * auVar159._8_4_;
                auVar193._12_4_ = auVar192._12_4_ * auVar89._12_4_ * auVar159._12_4_;
                auVar271._0_4_ = auVar304._0_4_ * auVar192._0_4_;
                auVar271._4_4_ = auVar304._4_4_ * auVar192._4_4_;
                auVar271._8_4_ = auVar304._8_4_ * auVar192._8_4_;
                auVar271._12_4_ = auVar304._12_4_ * auVar192._12_4_;
                if (fVar320 < 0.0) {
                  local_ae0._0_16_ = auVar243;
                  local_980._0_16_ = auVar271;
                  local_a60._0_16_ = auVar193;
                  fVar320 = sqrtf(fVar320);
                  auVar193 = local_a60._0_16_;
                  auVar243 = local_ae0._0_16_;
                  auVar271 = local_980._0_16_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  fVar320 = auVar94._0_4_;
                }
                auVar94 = vdpps_avx(_local_b40,auVar271,0x7f);
                fVar319 = ((float)local_b20._0_4_ / fVar320) * (fVar319 + 1.0) +
                          auVar24._0_4_ + fVar319 * (float)local_b20._0_4_;
                auVar159 = vdpps_avx(auVar243,auVar271,0x7f);
                auVar192 = vdpps_avx(_local_b40,auVar193,0x7f);
                auVar89 = vdpps_avx(_local_a10,auVar271,0x7f);
                auVar90 = vdpps_avx(_local_b40,auVar243,0x7f);
                fVar320 = auVar159._0_4_ + auVar192._0_4_;
                fVar327 = auVar94._0_4_;
                auVar95._0_4_ = fVar327 * fVar327;
                auVar95._4_4_ = auVar94._4_4_ * auVar94._4_4_;
                auVar95._8_4_ = auVar94._8_4_ * auVar94._8_4_;
                auVar95._12_4_ = auVar94._12_4_ * auVar94._12_4_;
                auVar192 = vsubps_avx(auVar195,auVar95);
                auVar159 = vdpps_avx(_local_b40,_local_a10,0x7f);
                fVar334 = auVar90._0_4_ - fVar327 * fVar320;
                fVar336 = auVar159._0_4_ - fVar327 * auVar89._0_4_;
                auVar159 = vrsqrtss_avx(auVar192,auVar192);
                fVar338 = auVar192._0_4_;
                fVar327 = auVar159._0_4_;
                fVar327 = fVar327 * 1.5 + fVar338 * -0.5 * fVar327 * fVar327 * fVar327;
                if (fVar338 < 0.0) {
                  local_ae0._0_4_ = fVar319;
                  local_980._0_16_ = auVar89;
                  local_a60._0_16_ = ZEXT416((uint)fVar320);
                  local_9e0._0_4_ = fVar334;
                  local_a00._0_4_ = fVar336;
                  local_840._0_4_ = fVar327;
                  fVar338 = sqrtf(fVar338);
                  fVar327 = (float)local_840._0_4_;
                  fVar334 = (float)local_9e0._0_4_;
                  fVar336 = (float)local_a00._0_4_;
                  auVar89 = local_980._0_16_;
                  fVar319 = (float)local_ae0._0_4_;
                  auVar159 = local_a60._0_16_;
                }
                else {
                  auVar159 = vsqrtss_avx(auVar192,auVar192);
                  fVar338 = auVar159._0_4_;
                  auVar159 = ZEXT416((uint)fVar320);
                }
                auVar90 = vpermilps_avx(local_9a0._0_16_,0xff);
                auVar99 = vshufps_avx(auVar304,auVar304,0xff);
                fVar320 = fVar334 * fVar327 - auVar99._0_4_;
                auVar216._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar216._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar216._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar244._0_4_ = -fVar320;
                auVar244._4_4_ = 0x80000000;
                auVar244._8_4_ = 0x80000000;
                auVar244._12_4_ = 0x80000000;
                auVar192 = vinsertps_avx(auVar244,ZEXT416((uint)(fVar336 * fVar327)),0x1c);
                auVar89 = vmovsldup_avx(ZEXT416((uint)(auVar159._0_4_ * fVar336 * fVar327 -
                                                      auVar89._0_4_ * fVar320)));
                auVar192 = vdivps_avx(auVar192,auVar89);
                auVar159 = vinsertps_avx(auVar159,auVar216,0x10);
                auVar159 = vdivps_avx(auVar159,auVar89);
                auVar89 = vmovsldup_avx(auVar94);
                auVar96 = ZEXT416((uint)(fVar338 - auVar90._0_4_));
                auVar90 = vmovsldup_avx(auVar96);
                auVar160._0_4_ = auVar89._0_4_ * auVar192._0_4_ + auVar90._0_4_ * auVar159._0_4_;
                auVar160._4_4_ = auVar89._4_4_ * auVar192._4_4_ + auVar90._4_4_ * auVar159._4_4_;
                auVar160._8_4_ = auVar89._8_4_ * auVar192._8_4_ + auVar90._8_4_ * auVar159._8_4_;
                auVar160._12_4_ =
                     auVar89._12_4_ * auVar192._12_4_ + auVar90._12_4_ * auVar159._12_4_;
                auVar159 = vsubps_avx(auVar270,auVar160);
                auVar232 = ZEXT1664(auVar159);
                auVar161._8_4_ = 0x7fffffff;
                auVar161._0_8_ = 0x7fffffff7fffffff;
                auVar161._12_4_ = 0x7fffffff;
                auVar270 = vandps_avx(auVar94,auVar161);
              } while (fVar319 <= auVar270._0_4_);
              auVar194._8_4_ = 0x7fffffff;
              auVar194._0_8_ = 0x7fffffff7fffffff;
              auVar194._12_4_ = 0x7fffffff;
              auVar270 = vandps_avx(auVar96,auVar194);
            } while ((float)local_860._0_4_ * 1.9073486e-06 + auVar24._0_4_ + fVar319 <=
                     auVar270._0_4_);
            fVar319 = auVar159._0_4_ + (float)local_960._0_4_;
            if ((fVar310 <= fVar319) &&
               (fVar320 = *(float *)(ray + k * 4 + 0x100), fVar319 <= fVar320)) {
              auVar270 = vmovshdup_avx(auVar159);
              fVar327 = auVar270._0_4_;
              if ((0.0 <= fVar327) && (fVar327 <= 1.0)) {
                auVar195 = vrsqrtss_avx(auVar195,auVar195);
                fVar334 = auVar195._0_4_;
                pGVar10 = (context->scene->geometries).items[uVar81].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar195 = ZEXT416((uint)(fVar334 * 1.5 +
                                           fVar318 * -0.5 * fVar334 * fVar334 * fVar334));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  auVar196._0_4_ = auVar195._0_4_ * (float)local_b40._0_4_;
                  auVar196._4_4_ = auVar195._4_4_ * (float)local_b40._4_4_;
                  auVar196._8_4_ = auVar195._8_4_ * fStack_b38;
                  auVar196._12_4_ = auVar195._12_4_ * fStack_b34;
                  auVar132._0_4_ = auVar304._0_4_ + auVar99._0_4_ * auVar196._0_4_;
                  auVar132._4_4_ = auVar304._4_4_ + auVar99._4_4_ * auVar196._4_4_;
                  auVar132._8_4_ = auVar304._8_4_ + auVar99._8_4_ * auVar196._8_4_;
                  auVar132._12_4_ = auVar304._12_4_ + auVar99._12_4_ * auVar196._12_4_;
                  auVar195 = vshufps_avx(auVar196,auVar196,0xc9);
                  auVar270 = vshufps_avx(auVar304,auVar304,0xc9);
                  auVar197._0_4_ = auVar270._0_4_ * auVar196._0_4_;
                  auVar197._4_4_ = auVar270._4_4_ * auVar196._4_4_;
                  auVar197._8_4_ = auVar270._8_4_ * auVar196._8_4_;
                  auVar197._12_4_ = auVar270._12_4_ * auVar196._12_4_;
                  auVar217._0_4_ = auVar304._0_4_ * auVar195._0_4_;
                  auVar217._4_4_ = auVar304._4_4_ * auVar195._4_4_;
                  auVar217._8_4_ = auVar304._8_4_ * auVar195._8_4_;
                  auVar217._12_4_ = auVar304._12_4_ * auVar195._12_4_;
                  auVar24 = vsubps_avx(auVar217,auVar197);
                  auVar195 = vshufps_avx(auVar24,auVar24,0xc9);
                  auVar270 = vshufps_avx(auVar132,auVar132,0xc9);
                  auVar218._0_4_ = auVar270._0_4_ * auVar195._0_4_;
                  auVar218._4_4_ = auVar270._4_4_ * auVar195._4_4_;
                  auVar218._8_4_ = auVar270._8_4_ * auVar195._8_4_;
                  auVar218._12_4_ = auVar270._12_4_ * auVar195._12_4_;
                  auVar195 = vshufps_avx(auVar24,auVar24,0xd2);
                  auVar133._0_4_ = auVar132._0_4_ * auVar195._0_4_;
                  auVar133._4_4_ = auVar132._4_4_ * auVar195._4_4_;
                  auVar133._8_4_ = auVar132._8_4_ * auVar195._8_4_;
                  auVar133._12_4_ = auVar132._12_4_ * auVar195._12_4_;
                  auVar195 = vsubps_avx(auVar218,auVar133);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar319;
                    uVar84 = vextractps_avx(auVar195,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar84;
                    uVar84 = vextractps_avx(auVar195,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar84;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar195._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar327;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_940;
                    *(uint *)(ray + k * 4 + 0x240) = uVar81;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar16 = context->user;
                    auStack_6b0 = vshufps_avx(auVar159,auVar159,0x55);
                    auStack_710 = vshufps_avx(auVar195,auVar195,0x55);
                    auStack_6f0 = vshufps_avx(auVar195,auVar195,0xaa);
                    auStack_6d0 = vshufps_avx(auVar195,auVar195,0);
                    local_720 = (RTCHitN  [16])auStack_710;
                    local_700 = auStack_6f0;
                    local_6e0 = auStack_6d0;
                    local_6c0 = auStack_6b0;
                    local_6a0 = ZEXT832(0) << 0x20;
                    local_680 = local_5c0._0_8_;
                    uStack_678 = local_5c0._8_8_;
                    uStack_670 = local_5c0._16_8_;
                    uStack_668 = local_5c0._24_8_;
                    local_660 = local_5a0;
                    auVar101 = vcmpps_avx(local_5a0,local_5a0,0xf);
                    local_a88[1] = auVar101;
                    *local_a88 = auVar101;
                    local_640 = pRVar16->instID[0];
                    uStack_63c = local_640;
                    uStack_638 = local_640;
                    uStack_634 = local_640;
                    uStack_630 = local_640;
                    uStack_62c = local_640;
                    uStack_628 = local_640;
                    uStack_624 = local_640;
                    local_620 = pRVar16->instPrimID[0];
                    uStack_61c = local_620;
                    uStack_618 = local_620;
                    uStack_614 = local_620;
                    uStack_610 = local_620;
                    uStack_60c = local_620;
                    uStack_608 = local_620;
                    uStack_604 = local_620;
                    *(float *)(ray + k * 4 + 0x100) = fVar319;
                    local_ba0 = *local_a90;
                    local_b90 = *local_a98;
                    local_b70.valid = (int *)local_ba0;
                    local_b70.geometryUserPtr = pGVar10->userPtr;
                    local_b70.context = context->user;
                    local_b70.hit = local_720;
                    local_b70.N = 8;
                    local_b70.ray = (RTCRayN *)ray;
                    if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar10->intersectionFilterN)(&local_b70);
                    }
                    auVar195 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                    auVar270 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                    auVar169._16_16_ = auVar270;
                    auVar169._0_16_ = auVar195;
                    auVar101 = _DAT_01f7b020 & ~auVar169;
                    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0x7f,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar101 >> 0xbf,0) != '\0') ||
                        (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar101[0x1f] < '\0') {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_b70);
                      }
                      auVar195 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar270 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar110._16_16_ = auVar270;
                      auVar110._0_16_ = auVar195;
                      auVar101 = _DAT_01f7b020 & ~auVar110;
                      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar101 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar101 >> 0x7f,0) != '\0') ||
                            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0xbf,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar101[0x1f] < '\0') {
                        auVar111._0_8_ = auVar195._0_8_ ^ 0xffffffffffffffff;
                        auVar111._8_4_ = auVar195._8_4_ ^ 0xffffffff;
                        auVar111._12_4_ = auVar195._12_4_ ^ 0xffffffff;
                        auVar111._16_4_ = auVar270._0_4_ ^ 0xffffffff;
                        auVar111._20_4_ = auVar270._4_4_ ^ 0xffffffff;
                        auVar111._24_4_ = auVar270._8_4_ ^ 0xffffffff;
                        auVar111._28_4_ = auVar270._12_4_ ^ 0xffffffff;
                        auVar101 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])local_b70.hit);
                        *(undefined1 (*) [32])(local_b70.ray + 0x180) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x20));
                        *(undefined1 (*) [32])(local_b70.ray + 0x1a0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x40));
                        *(undefined1 (*) [32])(local_b70.ray + 0x1c0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x60));
                        *(undefined1 (*) [32])(local_b70.ray + 0x1e0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x80));
                        *(undefined1 (*) [32])(local_b70.ray + 0x200) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b70.ray + 0x220) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b70.ray + 0x240) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b70.ray + 0x260) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar111,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x100));
                        *(undefined1 (*) [32])(local_b70.ray + 0x280) = auVar101;
                        goto LAB_008feff3;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar320;
                  }
                }
              }
            }
LAB_008feff3:
            uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar315._4_4_ = uVar84;
            auVar315._0_4_ = uVar84;
            auVar315._8_4_ = uVar84;
            auVar315._12_4_ = uVar84;
            auVar315._16_4_ = uVar84;
            auVar315._20_4_ = uVar84;
            auVar315._24_4_ = uVar84;
            auVar315._28_4_ = uVar84;
            auVar317 = ZEXT3264(auVar315);
            auVar101 = vcmpps_avx(_local_8a0,auVar315,2);
            auVar101 = vandps_avx(auVar101,local_4e0);
          }
          auVar112._0_4_ = (float)local_920._0_4_ + (float)local_880._0_4_;
          auVar112._4_4_ = (float)local_920._4_4_ + (float)local_880._4_4_;
          auVar112._8_4_ = fStack_918 + fStack_878;
          auVar112._12_4_ = fStack_914 + fStack_874;
          auVar112._16_4_ = fStack_910 + fStack_870;
          auVar112._20_4_ = fStack_90c + fStack_86c;
          auVar112._24_4_ = fStack_908 + fStack_868;
          auVar112._28_4_ = fStack_904 + fStack_864;
          auVar195 = vshufps_avx(auVar317._0_16_,auVar317._0_16_,0);
          auVar144._16_16_ = auVar195;
          auVar144._0_16_ = auVar195;
          auVar101 = vcmpps_avx(auVar112,auVar144,2);
          _local_8a0 = vandps_avx(auVar101,local_8e0);
          auVar113._8_4_ = 3;
          auVar113._0_8_ = 0x300000003;
          auVar113._12_4_ = 3;
          auVar113._16_4_ = 3;
          auVar113._20_4_ = 3;
          auVar113._24_4_ = 3;
          auVar113._28_4_ = 3;
          auVar145._8_4_ = 2;
          auVar145._0_8_ = 0x200000002;
          auVar145._12_4_ = 2;
          auVar145._16_4_ = 2;
          auVar145._20_4_ = 2;
          auVar145._24_4_ = 2;
          auVar145._28_4_ = 2;
          auVar101 = vblendvps_avx(auVar145,auVar113,local_7a0);
          auVar195 = vpcmpgtd_avx(auVar101._16_16_,local_820);
          auVar270 = vpshufd_avx(local_7c0._0_16_,0);
          auVar270 = vpcmpgtd_avx(auVar101._0_16_,auVar270);
          auVar146._16_16_ = auVar195;
          auVar146._0_16_ = auVar270;
          local_8e0 = vblendps_avx(ZEXT1632(auVar270),auVar146,0xf0);
          auVar101 = vandnps_avx(local_8e0,_local_8a0);
          local_800 = _local_480;
          local_880._4_4_ = (float)local_920._4_4_ + (float)local_480._4_4_;
          local_880._0_4_ = (float)local_920._0_4_ + (float)local_480._0_4_;
          fStack_878 = fStack_918 + fStack_478;
          fStack_874 = fStack_914 + fStack_474;
          fStack_870 = fStack_910 + fStack_470;
          fStack_86c = fStack_90c + fStack_46c;
          fStack_868 = fStack_908 + fStack_468;
          fStack_864 = fStack_904 + fStack_464;
          auVar333 = ZEXT3264(local_a40);
          auVar352 = ZEXT3264(local_b00);
          auVar279 = ZEXT3264(local_9c0);
          while( true ) {
            local_500 = auVar101;
            if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar101 >> 0x7f,0) == '\0') &&
                  (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar101 >> 0xbf,0) == '\0') &&
                (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar101[0x1f]) break;
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar102 = vblendvps_avx(auVar147,local_800,auVar101);
            auVar351 = vshufps_avx(auVar102,auVar102,0xb1);
            auVar351 = vminps_avx(auVar102,auVar351);
            auVar103 = vshufpd_avx(auVar351,auVar351,5);
            auVar351 = vminps_avx(auVar351,auVar103);
            auVar103 = vperm2f128_avx(auVar351,auVar351,1);
            auVar351 = vminps_avx(auVar351,auVar103);
            auVar102 = vcmpps_avx(auVar102,auVar351,0);
            auVar351 = auVar101 & auVar102;
            if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar351 >> 0x7f,0) != '\0') ||
                  (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar351 >> 0xbf,0) != '\0') ||
                (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar351[0x1f] < '\0') {
              auVar101 = vandps_avx(auVar102,auVar101);
            }
            uVar76 = vmovmskps_avx(auVar101);
            uVar85 = 0;
            if (uVar76 != 0) {
              for (; (uVar76 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
              }
            }
            uVar79 = (ulong)uVar85;
            *(undefined4 *)(local_500 + uVar79 * 4) = 0;
            fVar318 = local_1c0[uVar79];
            uVar85 = *(uint *)(local_460 + uVar79 * 4);
            fVar319 = auVar21._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar319 = sqrtf((float)local_a20._0_4_);
              auVar279 = ZEXT3264(local_9c0);
              auVar352 = ZEXT3264(local_b00);
              auVar333 = ZEXT3264(local_a40);
            }
            auVar270 = vminps_avx(auVar23,auVar25);
            auVar195 = vmaxps_avx(auVar23,auVar25);
            auVar24 = vminps_avx(auVar22,_local_b80);
            auVar94 = vminps_avx(auVar270,auVar24);
            auVar270 = vmaxps_avx(auVar22,_local_b80);
            auVar24 = vmaxps_avx(auVar195,auVar270);
            auVar198._8_4_ = 0x7fffffff;
            auVar198._0_8_ = 0x7fffffff7fffffff;
            auVar198._12_4_ = 0x7fffffff;
            auVar195 = vandps_avx(auVar94,auVar198);
            auVar270 = vandps_avx(auVar24,auVar198);
            auVar195 = vmaxps_avx(auVar195,auVar270);
            auVar270 = vmovshdup_avx(auVar195);
            auVar270 = vmaxss_avx(auVar270,auVar195);
            auVar195 = vshufpd_avx(auVar195,auVar195,1);
            auVar195 = vmaxss_avx(auVar195,auVar270);
            local_b20._0_4_ = auVar195._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar319 * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar24,auVar24,0xff);
            auVar195 = vinsertps_avx(ZEXT416(uVar85),ZEXT416((uint)fVar318),0x10);
            auVar232 = ZEXT1664(auVar195);
            lVar83 = 5;
            do {
              do {
                bVar86 = lVar83 == 0;
                lVar83 = lVar83 + -1;
                if (bVar86) goto LAB_008ffbc5;
                auVar270 = auVar232._0_16_;
                auVar195 = vmovshdup_avx(auVar270);
                fVar284 = auVar195._0_4_;
                fVar334 = 1.0 - fVar284;
                auVar195 = vshufps_avx(auVar270,auVar270,0x55);
                fVar318 = auVar195._0_4_;
                fVar319 = auVar195._4_4_;
                fVar320 = auVar195._8_4_;
                fVar327 = auVar195._12_4_;
                auVar195 = vshufps_avx(ZEXT416((uint)fVar334),ZEXT416((uint)fVar334),0);
                fVar336 = auVar195._0_4_;
                fVar338 = auVar195._4_4_;
                fVar149 = auVar195._8_4_;
                fVar185 = auVar195._12_4_;
                fVar208 = local_c70 * fVar318 + local_c80 * fVar336;
                fVar209 = fStack_c6c * fVar319 + fStack_c7c * fVar338;
                fVar264 = fStack_c68 * fVar320 + fStack_c78 * fVar149;
                fVar280 = fStack_c64 * fVar327 + fStack_c74 * fVar185;
                auVar245._0_4_ =
                     fVar336 * (local_c80 * fVar318 + fVar336 * local_ca0) + fVar318 * fVar208;
                auVar245._4_4_ =
                     fVar338 * (fStack_c7c * fVar319 + fVar338 * fStack_c9c) + fVar319 * fVar209;
                auVar245._8_4_ =
                     fVar149 * (fStack_c78 * fVar320 + fVar149 * fStack_c98) + fVar320 * fVar264;
                auVar245._12_4_ =
                     fVar185 * (fStack_c74 * fVar327 + fVar185 * fStack_c94) + fVar327 * fVar280;
                auVar199._0_4_ =
                     fVar336 * fVar208 +
                     fVar318 * (fVar318 * (float)local_b80._0_4_ + local_c70 * fVar336);
                auVar199._4_4_ =
                     fVar338 * fVar209 +
                     fVar319 * (fVar319 * (float)local_b80._4_4_ + fStack_c6c * fVar338);
                auVar199._8_4_ =
                     fVar149 * fVar264 + fVar320 * (fVar320 * fStack_b78 + fStack_c68 * fVar149);
                auVar199._12_4_ =
                     fVar185 * fVar280 + fVar327 * (fVar327 * fStack_b74 + fStack_c64 * fVar185);
                auVar195 = vshufps_avx(auVar270,auVar270,0);
                auVar134._0_4_ = auVar195._0_4_ * (float)local_a10._0_4_ + 0.0;
                auVar134._4_4_ = auVar195._4_4_ * (float)local_a10._4_4_ + 0.0;
                auVar134._8_4_ = auVar195._8_4_ * fStack_a08 + 0.0;
                auVar134._12_4_ = auVar195._12_4_ * fStack_a04 + 0.0;
                auVar97._0_4_ = fVar336 * auVar245._0_4_ + fVar318 * auVar199._0_4_;
                auVar97._4_4_ = fVar338 * auVar245._4_4_ + fVar319 * auVar199._4_4_;
                auVar97._8_4_ = fVar149 * auVar245._8_4_ + fVar320 * auVar199._8_4_;
                auVar97._12_4_ = fVar185 * auVar245._12_4_ + fVar327 * auVar199._12_4_;
                local_9a0._0_16_ = auVar97;
                auVar195 = vsubps_avx(auVar134,auVar97);
                _local_b40 = auVar195;
                auVar195 = vdpps_avx(auVar195,auVar195,0x7f);
                fVar318 = auVar195._0_4_;
                if (fVar318 < 0.0) {
                  local_ac0._0_16_ = auVar245;
                  fVar319 = sqrtf(fVar318);
                  auVar232 = ZEXT1664(auVar270);
                  auVar245 = local_ac0._0_16_;
                }
                else {
                  auVar24 = vsqrtss_avx(auVar195,auVar195);
                  fVar319 = auVar24._0_4_;
                }
                auVar24 = vsubps_avx(auVar199,auVar245);
                auVar272._0_4_ = auVar24._0_4_ * 3.0;
                auVar272._4_4_ = auVar24._4_4_ * 3.0;
                auVar272._8_4_ = auVar24._8_4_ * 3.0;
                auVar272._12_4_ = auVar24._12_4_ * 3.0;
                auVar24 = vshufps_avx(ZEXT416((uint)(fVar284 * 6.0)),ZEXT416((uint)(fVar284 * 6.0)),
                                      0);
                auVar94 = ZEXT416((uint)((fVar334 - (fVar284 + fVar284)) * 6.0));
                auVar159 = vshufps_avx(auVar94,auVar94,0);
                auVar94 = ZEXT416((uint)((fVar284 - (fVar334 + fVar334)) * 6.0));
                auVar192 = vshufps_avx(auVar94,auVar94,0);
                auVar89 = vshufps_avx(ZEXT416((uint)(fVar334 * 6.0)),ZEXT416((uint)(fVar334 * 6.0)),
                                      0);
                auVar94 = vdpps_avx(auVar272,auVar272,0x7f);
                auVar135._0_4_ =
                     auVar89._0_4_ * local_ca0 +
                     auVar192._0_4_ * local_c80 +
                     auVar24._0_4_ * (float)local_b80._0_4_ + auVar159._0_4_ * local_c70;
                auVar135._4_4_ =
                     auVar89._4_4_ * fStack_c9c +
                     auVar192._4_4_ * fStack_c7c +
                     auVar24._4_4_ * (float)local_b80._4_4_ + auVar159._4_4_ * fStack_c6c;
                auVar135._8_4_ =
                     auVar89._8_4_ * fStack_c98 +
                     auVar192._8_4_ * fStack_c78 +
                     auVar24._8_4_ * fStack_b78 + auVar159._8_4_ * fStack_c68;
                auVar135._12_4_ =
                     auVar89._12_4_ * fStack_c94 +
                     auVar192._12_4_ * fStack_c74 +
                     auVar24._12_4_ * fStack_b74 + auVar159._12_4_ * fStack_c64;
                auVar24 = vblendps_avx(auVar94,_DAT_01f45a50,0xe);
                auVar159 = vrsqrtss_avx(auVar24,auVar24);
                fVar327 = auVar159._0_4_;
                fVar320 = auVar94._0_4_;
                auVar159 = vdpps_avx(auVar272,auVar135,0x7f);
                auVar192 = vshufps_avx(auVar94,auVar94,0);
                auVar136._0_4_ = auVar135._0_4_ * auVar192._0_4_;
                auVar136._4_4_ = auVar135._4_4_ * auVar192._4_4_;
                auVar136._8_4_ = auVar135._8_4_ * auVar192._8_4_;
                auVar136._12_4_ = auVar135._12_4_ * auVar192._12_4_;
                auVar159 = vshufps_avx(auVar159,auVar159,0);
                auVar219._0_4_ = auVar272._0_4_ * auVar159._0_4_;
                auVar219._4_4_ = auVar272._4_4_ * auVar159._4_4_;
                auVar219._8_4_ = auVar272._8_4_ * auVar159._8_4_;
                auVar219._12_4_ = auVar272._12_4_ * auVar159._12_4_;
                auVar89 = vsubps_avx(auVar136,auVar219);
                auVar159 = vrcpss_avx(auVar24,auVar24);
                auVar24 = vmaxss_avx(ZEXT416((uint)local_b20._0_4_),
                                     ZEXT416((uint)(auVar232._0_4_ * (float)local_980._0_4_)));
                auVar159 = ZEXT416((uint)(auVar159._0_4_ * (2.0 - fVar320 * auVar159._0_4_)));
                auVar159 = vshufps_avx(auVar159,auVar159,0);
                uVar79 = CONCAT44(auVar272._4_4_,auVar272._0_4_);
                auVar313._0_8_ = uVar79 ^ 0x8000000080000000;
                auVar313._8_4_ = -auVar272._8_4_;
                auVar313._12_4_ = -auVar272._12_4_;
                auVar192 = ZEXT416((uint)(fVar327 * 1.5 +
                                         fVar320 * -0.5 * fVar327 * fVar327 * fVar327));
                auVar192 = vshufps_avx(auVar192,auVar192,0);
                auVar200._0_4_ = auVar192._0_4_ * auVar89._0_4_ * auVar159._0_4_;
                auVar200._4_4_ = auVar192._4_4_ * auVar89._4_4_ * auVar159._4_4_;
                auVar200._8_4_ = auVar192._8_4_ * auVar89._8_4_ * auVar159._8_4_;
                auVar200._12_4_ = auVar192._12_4_ * auVar89._12_4_ * auVar159._12_4_;
                local_ae0._0_4_ = auVar272._0_4_ * auVar192._0_4_;
                local_ae0._4_4_ = auVar272._4_4_ * auVar192._4_4_;
                local_ae0._8_4_ = auVar272._8_4_ * auVar192._8_4_;
                local_ae0._12_4_ = auVar272._12_4_ * auVar192._12_4_;
                if (fVar320 < 0.0) {
                  local_ac0._0_4_ = fVar319;
                  local_a60._0_16_ = auVar200;
                  fVar320 = sqrtf(fVar320);
                  auVar200 = local_a60._0_16_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  fVar320 = auVar94._0_4_;
                  local_ac0._0_4_ = fVar319;
                }
                auVar94 = vdpps_avx(_local_b40,local_ae0._0_16_,0x7f);
                fVar319 = ((float)local_b20._0_4_ / fVar320) * ((float)local_ac0._0_4_ + 1.0) +
                          auVar24._0_4_ + (float)local_ac0._0_4_ * (float)local_b20._0_4_;
                auVar159 = vdpps_avx(auVar313,local_ae0._0_16_,0x7f);
                auVar192 = vdpps_avx(_local_b40,auVar200,0x7f);
                auVar89 = vdpps_avx(_local_a10,local_ae0._0_16_,0x7f);
                auVar90 = vdpps_avx(_local_b40,auVar313,0x7f);
                fVar320 = auVar159._0_4_ + auVar192._0_4_;
                fVar327 = auVar94._0_4_;
                auVar98._0_4_ = fVar327 * fVar327;
                auVar98._4_4_ = auVar94._4_4_ * auVar94._4_4_;
                auVar98._8_4_ = auVar94._8_4_ * auVar94._8_4_;
                auVar98._12_4_ = auVar94._12_4_ * auVar94._12_4_;
                auVar192 = vsubps_avx(auVar195,auVar98);
                local_ae0._0_16_ = ZEXT416((uint)fVar320);
                auVar159 = vdpps_avx(_local_b40,_local_a10,0x7f);
                fVar334 = auVar90._0_4_ - fVar327 * fVar320;
                local_ac0._0_16_ = auVar94;
                fVar327 = auVar159._0_4_ - fVar327 * auVar89._0_4_;
                auVar94 = vrsqrtss_avx(auVar192,auVar192);
                fVar336 = auVar192._0_4_;
                fVar320 = auVar94._0_4_;
                fVar320 = fVar320 * 1.5 + fVar336 * -0.5 * fVar320 * fVar320 * fVar320;
                if (fVar336 < 0.0) {
                  local_a60._0_16_ = auVar89;
                  local_9e0._0_4_ = fVar334;
                  local_a00._0_4_ = fVar327;
                  local_840._0_4_ = fVar320;
                  fVar336 = sqrtf(fVar336);
                  fVar320 = (float)local_840._0_4_;
                  fVar334 = (float)local_9e0._0_4_;
                  fVar327 = (float)local_a00._0_4_;
                  auVar89 = local_a60._0_16_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar192,auVar192);
                  fVar336 = auVar94._0_4_;
                }
                auVar333 = ZEXT3264(local_a40);
                auVar352 = ZEXT3264(local_b00);
                auVar99 = vpermilps_avx(local_9a0._0_16_,0xff);
                auVar90 = vshufps_avx(auVar272,auVar272,0xff);
                fVar334 = fVar334 * fVar320 - auVar90._0_4_;
                auVar220._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar220._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar220._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar246._0_4_ = -fVar334;
                auVar246._4_4_ = 0x80000000;
                auVar246._8_4_ = 0x80000000;
                auVar246._12_4_ = 0x80000000;
                auVar94 = vinsertps_avx(auVar246,ZEXT416((uint)(fVar327 * fVar320)),0x1c);
                auVar192 = vmovsldup_avx(ZEXT416((uint)(local_ae0._0_4_ * fVar327 * fVar320 -
                                                       auVar89._0_4_ * fVar334)));
                auVar94 = vdivps_avx(auVar94,auVar192);
                auVar159 = vinsertps_avx(local_ae0._0_16_,auVar220,0x10);
                auVar159 = vdivps_avx(auVar159,auVar192);
                auVar192 = vmovsldup_avx(local_ac0._0_16_);
                auVar99 = ZEXT416((uint)(fVar336 - auVar99._0_4_));
                auVar89 = vmovsldup_avx(auVar99);
                auVar162._0_4_ = auVar192._0_4_ * auVar94._0_4_ + auVar89._0_4_ * auVar159._0_4_;
                auVar162._4_4_ = auVar192._4_4_ * auVar94._4_4_ + auVar89._4_4_ * auVar159._4_4_;
                auVar162._8_4_ = auVar192._8_4_ * auVar94._8_4_ + auVar89._8_4_ * auVar159._8_4_;
                auVar162._12_4_ =
                     auVar192._12_4_ * auVar94._12_4_ + auVar89._12_4_ * auVar159._12_4_;
                auVar94 = vsubps_avx(auVar270,auVar162);
                auVar232 = ZEXT1664(auVar94);
                auVar163._8_4_ = 0x7fffffff;
                auVar163._0_8_ = 0x7fffffff7fffffff;
                auVar163._12_4_ = 0x7fffffff;
                auVar270 = vandps_avx(local_ac0._0_16_,auVar163);
                auVar279 = ZEXT3264(local_9c0);
              } while (fVar319 <= auVar270._0_4_);
              auVar201._8_4_ = 0x7fffffff;
              auVar201._0_8_ = 0x7fffffff7fffffff;
              auVar201._12_4_ = 0x7fffffff;
              auVar270 = vandps_avx(auVar99,auVar201);
            } while ((float)local_860._0_4_ * 1.9073486e-06 + auVar24._0_4_ + fVar319 <=
                     auVar270._0_4_);
            fVar319 = auVar94._0_4_ + (float)local_960._0_4_;
            if ((fVar310 <= fVar319) &&
               (fVar320 = *(float *)(ray + k * 4 + 0x100), fVar319 <= fVar320)) {
              auVar270 = vmovshdup_avx(auVar94);
              fVar327 = auVar270._0_4_;
              if ((0.0 <= fVar327) && (fVar327 <= 1.0)) {
                auVar195 = vrsqrtss_avx(auVar195,auVar195);
                fVar334 = auVar195._0_4_;
                pGVar10 = (context->scene->geometries).items[uVar81].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar195 = ZEXT416((uint)(fVar334 * 1.5 +
                                           fVar318 * -0.5 * fVar334 * fVar334 * fVar334));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  auVar202._0_4_ = auVar195._0_4_ * (float)local_b40._0_4_;
                  auVar202._4_4_ = auVar195._4_4_ * (float)local_b40._4_4_;
                  auVar202._8_4_ = auVar195._8_4_ * fStack_b38;
                  auVar202._12_4_ = auVar195._12_4_ * fStack_b34;
                  auVar137._0_4_ = auVar272._0_4_ + auVar90._0_4_ * auVar202._0_4_;
                  auVar137._4_4_ = auVar272._4_4_ + auVar90._4_4_ * auVar202._4_4_;
                  auVar137._8_4_ = auVar272._8_4_ + auVar90._8_4_ * auVar202._8_4_;
                  auVar137._12_4_ = auVar272._12_4_ + auVar90._12_4_ * auVar202._12_4_;
                  auVar195 = vshufps_avx(auVar202,auVar202,0xc9);
                  auVar270 = vshufps_avx(auVar272,auVar272,0xc9);
                  auVar203._0_4_ = auVar270._0_4_ * auVar202._0_4_;
                  auVar203._4_4_ = auVar270._4_4_ * auVar202._4_4_;
                  auVar203._8_4_ = auVar270._8_4_ * auVar202._8_4_;
                  auVar203._12_4_ = auVar270._12_4_ * auVar202._12_4_;
                  auVar221._0_4_ = auVar272._0_4_ * auVar195._0_4_;
                  auVar221._4_4_ = auVar272._4_4_ * auVar195._4_4_;
                  auVar221._8_4_ = auVar272._8_4_ * auVar195._8_4_;
                  auVar221._12_4_ = auVar272._12_4_ * auVar195._12_4_;
                  auVar24 = vsubps_avx(auVar221,auVar203);
                  auVar195 = vshufps_avx(auVar24,auVar24,0xc9);
                  auVar270 = vshufps_avx(auVar137,auVar137,0xc9);
                  auVar222._0_4_ = auVar270._0_4_ * auVar195._0_4_;
                  auVar222._4_4_ = auVar270._4_4_ * auVar195._4_4_;
                  auVar222._8_4_ = auVar270._8_4_ * auVar195._8_4_;
                  auVar222._12_4_ = auVar270._12_4_ * auVar195._12_4_;
                  auVar195 = vshufps_avx(auVar24,auVar24,0xd2);
                  auVar138._0_4_ = auVar137._0_4_ * auVar195._0_4_;
                  auVar138._4_4_ = auVar137._4_4_ * auVar195._4_4_;
                  auVar138._8_4_ = auVar137._8_4_ * auVar195._8_4_;
                  auVar138._12_4_ = auVar137._12_4_ * auVar195._12_4_;
                  auVar195 = vsubps_avx(auVar222,auVar138);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar319;
                    uVar84 = vextractps_avx(auVar195,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar84;
                    uVar84 = vextractps_avx(auVar195,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar84;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar195._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar327;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_940;
                    *(uint *)(ray + k * 4 + 0x240) = uVar81;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar16 = context->user;
                    auStack_6b0 = vshufps_avx(auVar94,auVar94,0x55);
                    auStack_710 = vshufps_avx(auVar195,auVar195,0x55);
                    auStack_6f0 = vshufps_avx(auVar195,auVar195,0xaa);
                    auStack_6d0 = vshufps_avx(auVar195,auVar195,0);
                    local_720 = (RTCHitN  [16])auStack_710;
                    local_700 = auStack_6f0;
                    local_6e0 = auStack_6d0;
                    local_6c0 = auStack_6b0;
                    local_6a0 = ZEXT832(0) << 0x20;
                    local_680 = local_5c0._0_8_;
                    uStack_678 = local_5c0._8_8_;
                    uStack_670 = local_5c0._16_8_;
                    uStack_668 = local_5c0._24_8_;
                    local_660 = local_5a0;
                    auVar101 = vcmpps_avx(local_5a0,local_5a0,0xf);
                    local_a88[1] = auVar101;
                    *local_a88 = auVar101;
                    local_640 = pRVar16->instID[0];
                    uStack_63c = local_640;
                    uStack_638 = local_640;
                    uStack_634 = local_640;
                    uStack_630 = local_640;
                    uStack_62c = local_640;
                    uStack_628 = local_640;
                    uStack_624 = local_640;
                    local_620 = pRVar16->instPrimID[0];
                    uStack_61c = local_620;
                    uStack_618 = local_620;
                    uStack_614 = local_620;
                    uStack_610 = local_620;
                    uStack_60c = local_620;
                    uStack_608 = local_620;
                    uStack_604 = local_620;
                    *(float *)(ray + k * 4 + 0x100) = fVar319;
                    local_ba0 = *local_a90;
                    local_b90 = *local_a98;
                    local_b70.valid = (int *)local_ba0;
                    local_b70.geometryUserPtr = pGVar10->userPtr;
                    local_b70.context = context->user;
                    local_b70.hit = local_720;
                    local_b70.N = 8;
                    local_b70.ray = (RTCRayN *)ray;
                    if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar10->intersectionFilterN)(&local_b70);
                      auVar279 = ZEXT3264(local_9c0);
                      auVar352 = ZEXT3264(local_b00);
                      auVar333 = ZEXT3264(local_a40);
                    }
                    auVar195 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                    auVar270 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                    auVar170._16_16_ = auVar270;
                    auVar170._0_16_ = auVar195;
                    auVar101 = _DAT_01f7b020 & ~auVar170;
                    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0x7f,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar101 >> 0xbf,0) != '\0') ||
                        (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar101[0x1f] < '\0') {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_b70);
                        auVar279 = ZEXT3264(local_9c0);
                        auVar352 = ZEXT3264(local_b00);
                        auVar333 = ZEXT3264(local_a40);
                      }
                      auVar195 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar270 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar114._16_16_ = auVar270;
                      auVar114._0_16_ = auVar195;
                      auVar101 = _DAT_01f7b020 & ~auVar114;
                      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar101 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar101 >> 0x7f,0) != '\0') ||
                            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0xbf,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar101[0x1f] < '\0') {
                        auVar115._0_8_ = auVar195._0_8_ ^ 0xffffffffffffffff;
                        auVar115._8_4_ = auVar195._8_4_ ^ 0xffffffff;
                        auVar115._12_4_ = auVar195._12_4_ ^ 0xffffffff;
                        auVar115._16_4_ = auVar270._0_4_ ^ 0xffffffff;
                        auVar115._20_4_ = auVar270._4_4_ ^ 0xffffffff;
                        auVar115._24_4_ = auVar270._8_4_ ^ 0xffffffff;
                        auVar115._28_4_ = auVar270._12_4_ ^ 0xffffffff;
                        auVar101 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])local_b70.hit);
                        *(undefined1 (*) [32])(local_b70.ray + 0x180) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x20));
                        *(undefined1 (*) [32])(local_b70.ray + 0x1a0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x40));
                        *(undefined1 (*) [32])(local_b70.ray + 0x1c0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x60));
                        *(undefined1 (*) [32])(local_b70.ray + 0x1e0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x80));
                        *(undefined1 (*) [32])(local_b70.ray + 0x200) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b70.ray + 0x220) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b70.ray + 0x240) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b70.ray + 0x260) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])
                                                            (local_b70.hit + 0x100));
                        *(undefined1 (*) [32])(local_b70.ray + 0x280) = auVar101;
                        goto LAB_008ffbc5;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar320;
                  }
                }
              }
            }
LAB_008ffbc5:
            uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar316._4_4_ = uVar84;
            auVar316._0_4_ = uVar84;
            auVar316._8_4_ = uVar84;
            auVar316._12_4_ = uVar84;
            auVar316._16_4_ = uVar84;
            auVar316._20_4_ = uVar84;
            auVar316._24_4_ = uVar84;
            auVar316._28_4_ = uVar84;
            auVar317 = ZEXT3264(auVar316);
            auVar101 = vcmpps_avx(_local_880,auVar316,2);
            auVar101 = vandps_avx(auVar101,local_500);
          }
          auVar101 = vandps_avx(local_780,local_760);
          auVar102 = vandps_avx(local_8e0,_local_8a0);
          auVar171._0_4_ = (float)local_920._0_4_ + local_4c0._0_4_;
          auVar171._4_4_ = (float)local_920._4_4_ + local_4c0._4_4_;
          auVar171._8_4_ = fStack_918 + local_4c0._8_4_;
          auVar171._12_4_ = fStack_914 + local_4c0._12_4_;
          auVar171._16_4_ = fStack_910 + local_4c0._16_4_;
          auVar171._20_4_ = fStack_90c + local_4c0._20_4_;
          auVar171._24_4_ = fStack_908 + local_4c0._24_4_;
          auVar171._28_4_ = fStack_904 + local_4c0._28_4_;
          auVar195 = vshufps_avx(auVar317._0_16_,auVar317._0_16_,0);
          auVar231._16_16_ = auVar195;
          auVar231._0_16_ = auVar195;
          auVar351 = vcmpps_avx(auVar171,auVar231,2);
          auVar101 = vandps_avx(auVar351,auVar101);
          auVar256._0_4_ = (float)local_920._0_4_ + local_480._0_4_;
          auVar256._4_4_ = (float)local_920._4_4_ + local_480._4_4_;
          auVar256._8_4_ = fStack_918 + local_480._8_4_;
          auVar256._12_4_ = fStack_914 + local_480._12_4_;
          auVar256._16_4_ = fStack_910 + local_480._16_4_;
          auVar256._20_4_ = fStack_90c + local_480._20_4_;
          auVar256._24_4_ = fStack_908 + local_480._24_4_;
          auVar256._28_4_ = fStack_904 + local_480._28_4_;
          auVar351 = vcmpps_avx(auVar256,auVar231,2);
          auVar102 = vandps_avx(auVar351,auVar102);
          auVar102 = vorps_avx(auVar101,auVar102);
          if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar102 >> 0x7f,0) != '\0') ||
                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0xbf,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar102[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar102;
            auVar101 = vblendvps_avx(_local_480,_local_4c0,auVar101);
            *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar101;
            uVar79 = vmovlps_avx(local_730);
            (&uStack_140)[uVar78 * 0xc] = uVar79;
            auStack_138[uVar78 * 0x18] = local_ce4 + 1;
            uVar78 = (ulong)((int)uVar78 + 1);
          }
          auVar232 = ZEXT3264(local_8c0);
          fVar153 = (float)local_920._0_4_;
          fVar173 = (float)local_920._4_4_;
          fVar175 = fStack_918;
          fVar177 = fStack_914;
          fVar179 = fStack_910;
          fVar181 = fStack_90c;
          fVar184 = fStack_908;
          fVar267 = fStack_904;
          goto LAB_008fe5d1;
        }
      }
      auVar232 = ZEXT3264(local_8c0);
      auVar333 = ZEXT3264(local_a40);
      auVar352 = ZEXT3264(local_b00);
      auVar279 = ZEXT3264(local_9c0);
    }
LAB_008fe5d1:
    while( true ) {
      uVar85 = (uint)uVar78;
      if (uVar85 == 0) {
        uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar100._4_4_ = uVar84;
        auVar100._0_4_ = uVar84;
        auVar100._8_4_ = uVar84;
        auVar100._12_4_ = uVar84;
        auVar127 = vcmpps_avx(local_740,auVar100,2);
        uVar81 = vmovmskps_avx(auVar127);
        uVar77 = (ulong)((uint)uVar77 - 1 & (uint)uVar77 & uVar81);
        goto LAB_008fd405;
      }
      uVar78 = (ulong)(uVar85 - 1);
      lVar83 = uVar78 * 0x60;
      auVar101 = *(undefined1 (*) [32])(auStack_160 + lVar83);
      auVar107._0_4_ = fVar153 + auVar101._0_4_;
      auVar107._4_4_ = fVar173 + auVar101._4_4_;
      auVar107._8_4_ = fVar175 + auVar101._8_4_;
      auVar107._12_4_ = fVar177 + auVar101._12_4_;
      auVar107._16_4_ = fVar179 + auVar101._16_4_;
      auVar107._20_4_ = fVar181 + auVar101._20_4_;
      auVar107._24_4_ = fVar184 + auVar101._24_4_;
      auVar107._28_4_ = fVar267 + auVar101._28_4_;
      uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar206._4_4_ = uVar84;
      auVar206._0_4_ = uVar84;
      auVar206._8_4_ = uVar84;
      auVar206._12_4_ = uVar84;
      auVar206._16_4_ = uVar84;
      auVar206._20_4_ = uVar84;
      auVar206._24_4_ = uVar84;
      auVar206._28_4_ = uVar84;
      auVar351 = vcmpps_avx(auVar107,auVar206,2);
      auVar102 = vandps_avx(auVar351,*(undefined1 (*) [32])(auStack_180 + lVar83));
      _local_720 = auVar102;
      auVar351 = *(undefined1 (*) [32])(auStack_180 + lVar83) & auVar351;
      if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar351 >> 0x7f,0) != '\0') ||
            (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar351 >> 0xbf,0) != '\0') ||
          (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar351[0x1f] < '\0') break;
      uVar78 = (ulong)(uVar85 - 1);
    }
    auVar167._8_4_ = 0x7f800000;
    auVar167._0_8_ = 0x7f8000007f800000;
    auVar167._12_4_ = 0x7f800000;
    auVar167._16_4_ = 0x7f800000;
    auVar167._20_4_ = 0x7f800000;
    auVar167._24_4_ = 0x7f800000;
    auVar167._28_4_ = 0x7f800000;
    auVar101 = vblendvps_avx(auVar167,auVar101,auVar102);
    auVar351 = vshufps_avx(auVar101,auVar101,0xb1);
    auVar351 = vminps_avx(auVar101,auVar351);
    auVar103 = vshufpd_avx(auVar351,auVar351,5);
    auVar351 = vminps_avx(auVar351,auVar103);
    auVar103 = vperm2f128_avx(auVar351,auVar351,1);
    auVar351 = vminps_avx(auVar351,auVar103);
    auVar101 = vcmpps_avx(auVar101,auVar351,0);
    auVar351 = auVar102 & auVar101;
    if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar351 >> 0x7f,0) != '\0') ||
          (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar351 >> 0xbf,0) != '\0') ||
        (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar351[0x1f] < '\0') {
      auVar102 = vandps_avx(auVar101,auVar102);
    }
    auVar128._8_8_ = 0;
    auVar128._0_8_ = (&uStack_140)[uVar78 * 0xc];
    local_ce4 = auStack_138[uVar78 * 0x18];
    uVar80 = vmovmskps_avx(auVar102);
    uVar76 = 0;
    if (uVar80 != 0) {
      for (; (uVar80 >> uVar76 & 1) == 0; uVar76 = uVar76 + 1) {
      }
    }
    *(undefined4 *)(local_720 + (ulong)uVar76 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar83) = _local_720;
    uVar80 = uVar85 - 1;
    if ((((((((_local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_720 >> 0x7f,0) != '\0') ||
          (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_720 >> 0xbf,0) != '\0') ||
        (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_720[0x1f] < '\0') {
      uVar80 = uVar85;
    }
    auVar195 = vshufps_avx(auVar128,auVar128,0);
    auVar270 = vshufps_avx(auVar128,auVar128,0x55);
    auVar270 = vsubps_avx(auVar270,auVar195);
    local_4c0._4_4_ = auVar195._4_4_ + auVar270._4_4_ * 0.14285715;
    local_4c0._0_4_ = auVar195._0_4_ + auVar270._0_4_ * 0.0;
    fStack_4b8 = auVar195._8_4_ + auVar270._8_4_ * 0.2857143;
    fStack_4b4 = auVar195._12_4_ + auVar270._12_4_ * 0.42857146;
    fStack_4b0 = auVar195._0_4_ + auVar270._0_4_ * 0.5714286;
    fStack_4ac = auVar195._4_4_ + auVar270._4_4_ * 0.71428573;
    fStack_4a8 = auVar195._8_4_ + auVar270._8_4_ * 0.8571429;
    fStack_4a4 = auVar195._12_4_ + auVar270._12_4_;
    local_730._8_8_ = 0;
    local_730._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar76 * 4);
    uVar78 = (ulong)uVar80;
    auVar351 = auVar352._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }